

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_generator.cc
# Opt level: O3

void grpc_go_generator::anon_unknown_0::GenerateService
               (Service *service,Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars)

{
  long lVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  size_type sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  long lVar9;
  _Alloc_hider _Var10;
  char cVar11;
  int iVar12;
  int iVar13;
  mapped_type *pmVar14;
  long *plVar15;
  undefined8 *puVar16;
  mapped_type *pmVar17;
  long *plVar18;
  CommentHolder *pCVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  CommentHolder *pCVar21;
  CommentHolder *pCVar22;
  pointer *__ptr;
  uint uVar23;
  ulong uVar24;
  char *pcVar25;
  pointer pcVar26;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var27;
  byte bVar28;
  pointer pcVar29;
  pointer pcVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  byte bVar32;
  char *pcVar33;
  Service *pSVar34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_3b8 [24];
  undefined3 uStack_3a0;
  undefined1 uStack_39d;
  undefined4 uStack_39c;
  undefined1 local_388 [24];
  undefined3 uStack_370;
  undefined1 uStack_36d;
  undefined2 uStack_36c;
  undefined1 uStack_36a;
  undefined1 uStack_369;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_358;
  undefined1 local_350 [48];
  undefined1 local_320 [8];
  pointer local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [2];
  undefined1 local_2f0 [48];
  key_type local_2c0;
  key_type local_2a0;
  undefined1 local_270 [48];
  Service *local_240;
  key_type local_238;
  CommentHolder *local_218;
  int local_20c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  int local_1d8;
  int local_1d4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  key_type local_1a0;
  char *local_180;
  size_type local_178;
  char local_170;
  undefined7 uStack_16f;
  undefined8 uStack_168;
  char *local_160;
  size_type local_158;
  char local_150;
  undefined7 uStack_14f;
  undefined8 uStack_148;
  char *local_140;
  size_type local_138;
  char local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  char *local_120;
  size_type local_118;
  char local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  char *local_100;
  size_type local_f8;
  char local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  key_type local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_240 = service;
  (*(service->super_CommentHolder)._vptr_CommentHolder[6])(&local_100,service);
  pcVar33 = local_100;
  uVar5 = stack0xfffffffffffffc5f;
  local_358 = &vars->_M_t;
  if (local_f8 == 0) {
    local_3b8._0_8_ = local_3b8 + 0x10;
    local_3b8[0x16] = (undefined1)((uint7)uStack_ef >> 0x28);
    local_3b8[0x17] = (undefined1)((uint7)uStack_ef >> 0x30);
    local_3b8._20_2_ = (undefined2)((uint7)uStack_ef >> 0x18);
    if (local_100 == &local_f0) {
      local_3b8._16_4_ = (undefined4)CONCAT71(uStack_ef,local_f0);
      uStack_3a0 = (undefined3)uStack_e8;
      uStack_39d = (undefined1)((ulong)uStack_e8 >> 0x18);
      uStack_39c = (undefined4)((ulong)uStack_e8 >> 0x20);
    }
    else {
      local_3b8._0_8_ = local_100;
      local_3b8._16_4_ = (undefined4)CONCAT71(uStack_ef,local_f0);
      uStack_3a0 = SUB43(uVar5,1);
    }
    local_3b8._8_8_ = 0;
  }
  else {
    iVar12 = toupper((int)*local_100);
    uVar5 = stack0xfffffffffffffc5f;
    *pcVar33 = (char)iVar12;
    local_3b8._0_8_ = local_3b8 + 0x10;
    local_3b8[0x16] = (undefined1)((uint7)uStack_ef >> 0x28);
    local_3b8[0x17] = (undefined1)((uint7)uStack_ef >> 0x30);
    local_3b8._20_2_ = (undefined2)((uint7)uStack_ef >> 0x18);
    if (local_100 == &local_f0) {
      local_3b8._16_4_ = (undefined4)CONCAT71(uStack_ef,local_f0);
      uStack_3a0 = (undefined3)uStack_e8;
      uStack_39d = (undefined1)((ulong)uStack_e8 >> 0x18);
      uStack_39c = (undefined4)((ulong)uStack_e8 >> 0x20);
    }
    else {
      local_3b8._0_8_ = local_100;
      local_3b8._16_4_ = (undefined4)CONCAT71(uStack_ef,local_f0);
      uStack_3a0 = SUB43(uVar5,1);
    }
    local_3b8._8_8_ = local_f8;
  }
  p_Var27 = local_358;
  local_100 = &local_f0;
  local_f8 = 0;
  local_f0 = '\0';
  pcVar29 = local_388 + 0x10;
  local_388._0_8_ = pcVar29;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Service","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_388);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
  if ((pointer)local_388._0_8_ != pcVar29) {
    operator_delete((void *)local_388._0_8_,
                    CONCAT17(local_388[0x17],
                             CONCAT16(local_388[0x16],CONCAT24(local_388._20_2_,local_388._16_4_)))
                    + 1);
  }
  if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
    operator_delete((void *)local_3b8._0_8_,
                    CONCAT17(local_3b8[0x17],
                             CONCAT16(local_3b8[0x16],CONCAT24(local_3b8._20_2_,local_3b8._16_4_)))
                    + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  (*printer->_vptr_Printer[2])(printer,p_Var27,"// Client API for $Service$ service\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type $Service$Client interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  local_3b8._0_8_ = local_3b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Ending","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_3b8);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x36cd50);
  if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
    operator_delete((void *)local_3b8._0_8_,
                    CONCAT17(local_3b8[0x17],
                             CONCAT16(local_3b8[0x16],CONCAT24(local_3b8._20_2_,local_3b8._16_4_)))
                    + 1);
  }
  pSVar34 = local_240;
  iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
  if (0 < iVar12) {
    uVar24 = 0;
    do {
      (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[9])(local_3b8,pSVar34,uVar24);
      uVar2 = local_3b8._0_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_60,local_358);
      GenerateClientMethodSignature
                ((Method *)uVar2,printer,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)0x0) {
        (*(*(_func_int ***)local_3b8._0_8_)[1])();
      }
      pSVar34 = local_240;
      uVar23 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar23;
      iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
    } while ((int)uVar23 < iVar12);
  }
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  local_388._0_8_ = pcVar29;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Service","");
  p_Var27 = local_358;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_358,(key_type *)local_388);
  pcVar30 = (pmVar14->_M_dataplus)._M_p;
  local_120 = &local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar30,pcVar30 + pmVar14->_M_string_length);
  pcVar33 = local_120;
  uVar5 = stack0xfffffffffffffc5f;
  if (local_118 == 0) {
    local_3b8._0_8_ = local_3b8 + 0x10;
    local_3b8[0x16] = (undefined1)((uint7)uStack_10f >> 0x28);
    local_3b8[0x17] = (undefined1)((uint7)uStack_10f >> 0x30);
    local_3b8._20_2_ = (undefined2)((uint7)uStack_10f >> 0x18);
    if (local_120 == &local_110) {
      local_3b8._16_4_ = (undefined4)CONCAT71(uStack_10f,local_110);
      uStack_3a0 = (undefined3)uStack_108;
      uStack_39d = (undefined1)((ulong)uStack_108 >> 0x18);
      uStack_39c = (undefined4)((ulong)uStack_108 >> 0x20);
    }
    else {
      local_3b8._0_8_ = local_120;
      local_3b8._16_4_ = (undefined4)CONCAT71(uStack_10f,local_110);
      uStack_3a0 = SUB43(uVar5,1);
    }
    local_3b8._8_8_ = 0;
  }
  else {
    iVar12 = tolower((int)*local_120);
    *pcVar33 = (char)iVar12;
    uVar5 = stack0xfffffffffffffc5f;
    local_3b8._0_8_ = local_3b8 + 0x10;
    local_3b8[0x16] = (undefined1)((uint7)uStack_10f >> 0x28);
    local_3b8[0x17] = (undefined1)((uint7)uStack_10f >> 0x30);
    local_3b8._20_2_ = (undefined2)((uint7)uStack_10f >> 0x18);
    if (local_120 == &local_110) {
      local_3b8._16_4_ = (undefined4)CONCAT71(uStack_10f,local_110);
      uStack_3a0 = (undefined3)uStack_108;
      uStack_39d = (undefined1)((ulong)uStack_108 >> 0x18);
      uStack_39c = (undefined4)((ulong)uStack_108 >> 0x20);
    }
    else {
      local_3b8._0_8_ = local_120;
      local_3b8._16_4_ = (undefined4)CONCAT71(uStack_10f,local_110);
      uStack_3a0 = SUB43(uVar5,1);
    }
    local_3b8._8_8_ = local_118;
    p_Var27 = local_358;
  }
  local_118 = 0;
  local_110 = '\0';
  local_350._0_8_ = local_350 + 0x10;
  local_120 = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"ServiceUnexported","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_350);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_,
                    CONCAT17(local_350[0x17],
                             CONCAT16(local_350[0x16],CONCAT24(local_350._20_2_,local_350._16_4_)))
                    + 1);
  }
  if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
    operator_delete((void *)local_3b8._0_8_,
                    CONCAT17(local_3b8[0x17],
                             CONCAT16(local_3b8[0x16],CONCAT24(local_3b8._20_2_,local_3b8._16_4_)))
                    + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  if ((pointer)local_388._0_8_ != pcVar29) {
    operator_delete((void *)local_388._0_8_,
                    CONCAT17(local_388[0x17],
                             CONCAT16(local_388[0x16],CONCAT24(local_388._20_2_,local_388._16_4_)))
                    + 1);
  }
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type $ServiceUnexported$Client struct {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"cc $grpc$.ClientConnInterface\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])
            (printer,p_Var27,
             "func New$Service$Client(cc $grpc$.ClientConnInterface) $Service$Client {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"return &$ServiceUnexported$Client{cc}");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"\n}\n\n");
  local_350._0_8_ = local_350 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"Service","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_350);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,"_",
                 pmVar14);
  plVar15 = (long *)std::__cxx11::string::append(local_388);
  local_3b8._0_8_ = local_3b8 + 0x10;
  plVar18 = plVar15 + 2;
  if ((long *)*plVar15 == plVar18) {
    local_3b8._16_4_ = (undefined4)*plVar18;
    uVar5 = *(undefined4 *)((long)plVar15 + 0x14);
    uStack_39c = *(undefined4 *)((long)plVar15 + 0x1c);
    local_3b8._20_2_ = (undefined2)uVar5;
    local_3b8[0x16] = (undefined1)((uint)uVar5 >> 0x10);
    uStack_3a0 = (undefined3)(int)plVar15[3];
    unique0x100047a4 = CONCAT31(uStack_3a0,(char)((uint)uVar5 >> 0x18));
    uStack_39d = (undefined1)((uint)(int)plVar15[3] >> 0x18);
  }
  else {
    lVar1 = *plVar18;
    local_3b8._16_4_ = (undefined4)lVar1;
    local_3b8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
    local_3b8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
    local_3b8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
    local_3b8._0_8_ = (long *)*plVar15;
  }
  local_3b8._8_8_ = plVar15[1];
  *plVar15 = (long)plVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"ServiceDesc","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,&local_2a0);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT17(local_2a0.field_2._M_local_buf[7],
                             CONCAT16(local_2a0.field_2._M_local_buf[6],
                                      CONCAT24(local_2a0.field_2._M_allocated_capacity._4_2_,
                                               local_2a0.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
    operator_delete((void *)local_3b8._0_8_,
                    CONCAT17(local_3b8[0x17],
                             CONCAT16(local_3b8[0x16],CONCAT24(local_3b8._20_2_,local_3b8._16_4_)))
                    + 1);
  }
  if ((pointer)local_388._0_8_ != pcVar29) {
    operator_delete((void *)local_388._0_8_,
                    CONCAT17(local_388[0x17],
                             CONCAT16(local_388[0x16],CONCAT24(local_388._20_2_,local_388._16_4_)))
                    + 1);
  }
  if ((CommentHolder *)local_350._0_8_ != (CommentHolder *)(local_350 + 0x10)) {
    operator_delete((void *)local_350._0_8_,
                    CONCAT17(local_350[0x17],
                             CONCAT16(local_350[0x16],CONCAT24(local_350._20_2_,local_350._16_4_)))
                    + 1);
  }
  pSVar34 = local_240;
  iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
  if (0 < iVar12) {
    local_1d4 = 0;
    local_1d8 = 0;
    iVar12 = 0;
    do {
      local_20c = iVar12;
      pcVar30 = local_3b8 + 0x10;
      pcVar29 = local_350 + 0x10;
      (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[9])(&local_218,pSVar34);
      iVar12 = (*((CommentHolder *)&local_218->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])();
      if ((char)iVar12 == '\0') {
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"ServiceDesc","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_358,&local_2a0);
        pcVar26 = (pmVar14->_M_dataplus)._M_p;
        local_350._0_8_ = pcVar29;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_350,pcVar26,pcVar26 + pmVar14->_M_string_length);
        std::__cxx11::string::append((char *)local_350);
        as_string<int>((string *)local_320,local_1d4);
        pcVar26 = (pointer)0xf;
        if ((pointer)local_350._0_8_ != pcVar29) {
          pcVar26 = (pointer)CONCAT17(local_350[0x17],
                                      CONCAT16(local_350[0x16],
                                               CONCAT24(local_350._20_2_,local_350._16_4_)));
        }
        if (pcVar26 < local_318 + local_350._8_8_) {
          pcVar26 = (pointer)0xf;
          if (local_320 != (undefined1  [8])local_310) {
            pcVar26 = (pointer)CONCAT17(local_310[0]._M_local_buf[7],
                                        CONCAT16(local_310[0]._M_local_buf[6],
                                                 CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                          (undefined4)
                                                          local_310[0]._M_allocated_capacity)));
          }
          if (pcVar26 < local_318 + local_350._8_8_) goto LAB_0033eaf1;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_320,0,(char *)0x0,local_350._0_8_);
        }
        else {
LAB_0033eaf1:
          puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_350,(ulong)local_320);
        }
        pcVar26 = (pointer)(puVar16 + 2);
        if ((pointer)*puVar16 == pcVar26) {
          uVar2 = *(undefined8 *)pcVar26;
          uVar8 = puVar16[3];
          local_388._16_4_ = (undefined4)uVar2;
          local_388._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
          local_388[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
          local_388[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
          uStack_370 = (undefined3)uVar8;
          uStack_36d = (undefined1)((ulong)uVar8 >> 0x18);
          uStack_36c = (undefined2)((ulong)uVar8 >> 0x20);
          uStack_36a = (undefined1)((ulong)uVar8 >> 0x30);
          uStack_369 = (undefined1)((ulong)uVar8 >> 0x38);
          local_388._0_8_ = local_388 + 0x10;
        }
        else {
          uVar2 = *(undefined8 *)pcVar26;
          local_388._16_4_ = (undefined4)uVar2;
          local_388._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
          local_388[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
          local_388[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
          local_388._0_8_ = (pointer)*puVar16;
        }
        local_388._8_8_ = puVar16[1];
        *puVar16 = pcVar26;
        puVar16[1] = 0;
        *pcVar26 = '\0';
        plVar15 = (long *)std::__cxx11::string::append(local_388);
        plVar18 = plVar15 + 2;
        if ((long *)*plVar15 == plVar18) {
          local_3b8._16_4_ = (undefined4)*plVar18;
          uVar5 = *(undefined4 *)((long)plVar15 + 0x14);
          uStack_39c = *(undefined4 *)((long)plVar15 + 0x1c);
          local_3b8._20_2_ = (undefined2)uVar5;
          local_3b8[0x16] = (undefined1)((uint)uVar5 >> 0x10);
          uStack_3a0 = (undefined3)(int)plVar15[3];
          unique0x100047ac = CONCAT31(uStack_3a0,(char)((uint)uVar5 >> 0x18));
          uStack_39d = (undefined1)((uint)(int)plVar15[3] >> 0x18);
          local_3b8._0_8_ = pcVar30;
        }
        else {
          lVar1 = *plVar18;
          local_3b8._16_4_ = (undefined4)lVar1;
          local_3b8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_3b8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_3b8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          local_3b8._0_8_ = (long *)*plVar15;
        }
        local_3b8._8_8_ = plVar15[1];
        *plVar15 = (long)plVar18;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_2f0._0_8_ = local_2f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"MethodDesc","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_358,(key_type *)local_2f0);
        std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
        if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,
                          CONCAT17(local_2f0[0x17],
                                   CONCAT16(local_2f0[0x16],
                                            CONCAT15(local_2f0[0x15],
                                                     CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) +
                          1);
        }
        if ((pointer)local_3b8._0_8_ != pcVar30) {
          operator_delete((void *)local_3b8._0_8_,
                          CONCAT17(local_3b8[0x17],
                                   CONCAT16(local_3b8[0x16],
                                            CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
        }
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_,
                          CONCAT17(local_388[0x17],
                                   CONCAT16(local_388[0x16],
                                            CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
        }
        if (local_320 != (undefined1  [8])local_310) {
          operator_delete((void *)local_320,
                          CONCAT17(local_310[0]._M_local_buf[7],
                                   CONCAT16(local_310[0]._M_local_buf[6],
                                            CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_310[0]._M_allocated_capacity)
                                           )) + 1);
        }
        if ((pointer)local_350._0_8_ != pcVar29) {
          operator_delete((void *)local_350._0_8_,
                          CONCAT17(local_350[0x17],
                                   CONCAT16(local_350[0x16],
                                            CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT17(local_2a0.field_2._M_local_buf[7],
                                   CONCAT16(local_2a0.field_2._M_local_buf[6],
                                            CONCAT24(local_2a0.field_2._M_allocated_capacity._4_2_,
                                                     local_2a0.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_1d4 = local_1d4 + 1;
      }
      else {
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"ServiceDesc","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_358,&local_2a0);
        pcVar26 = (pmVar14->_M_dataplus)._M_p;
        local_350._0_8_ = pcVar29;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_350,pcVar26,pcVar26 + pmVar14->_M_string_length);
        std::__cxx11::string::append((char *)local_350);
        as_string<int>((string *)local_320,local_1d8);
        pcVar26 = (pointer)0xf;
        if ((pointer)local_350._0_8_ != pcVar29) {
          pcVar26 = (pointer)CONCAT17(local_350[0x17],
                                      CONCAT16(local_350[0x16],
                                               CONCAT24(local_350._20_2_,local_350._16_4_)));
        }
        if (pcVar26 < local_318 + local_350._8_8_) {
          pcVar26 = (pointer)0xf;
          if (local_320 != (undefined1  [8])local_310) {
            pcVar26 = (pointer)CONCAT17(local_310[0]._M_local_buf[7],
                                        CONCAT16(local_310[0]._M_local_buf[6],
                                                 CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                          (undefined4)
                                                          local_310[0]._M_allocated_capacity)));
          }
          if (pcVar26 < local_318 + local_350._8_8_) goto LAB_0033ea0e;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_320,0,(char *)0x0,local_350._0_8_);
        }
        else {
LAB_0033ea0e:
          puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_350,(ulong)local_320);
        }
        pcVar26 = (pointer)(puVar16 + 2);
        if ((pointer)*puVar16 == pcVar26) {
          uVar2 = *(undefined8 *)pcVar26;
          uVar8 = puVar16[3];
          local_388._16_4_ = (undefined4)uVar2;
          local_388._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
          local_388[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
          local_388[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
          uStack_370 = (undefined3)uVar8;
          uStack_36d = (undefined1)((ulong)uVar8 >> 0x18);
          uStack_36c = (undefined2)((ulong)uVar8 >> 0x20);
          uStack_36a = (undefined1)((ulong)uVar8 >> 0x30);
          uStack_369 = (undefined1)((ulong)uVar8 >> 0x38);
          local_388._0_8_ = local_388 + 0x10;
        }
        else {
          uVar2 = *(undefined8 *)pcVar26;
          local_388._16_4_ = (undefined4)uVar2;
          local_388._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
          local_388[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
          local_388[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
          local_388._0_8_ = (pointer)*puVar16;
        }
        local_388._8_8_ = puVar16[1];
        *puVar16 = pcVar26;
        puVar16[1] = 0;
        *pcVar26 = '\0';
        plVar15 = (long *)std::__cxx11::string::append(local_388);
        plVar18 = plVar15 + 2;
        if ((long *)*plVar15 == plVar18) {
          local_3b8._16_4_ = (undefined4)*plVar18;
          uVar5 = *(undefined4 *)((long)plVar15 + 0x14);
          uStack_39c = *(undefined4 *)((long)plVar15 + 0x1c);
          local_3b8._20_2_ = (undefined2)uVar5;
          local_3b8[0x16] = (undefined1)((uint)uVar5 >> 0x10);
          uStack_3a0 = (undefined3)(int)plVar15[3];
          unique0x100047a8 = CONCAT31(uStack_3a0,(char)((uint)uVar5 >> 0x18));
          uStack_39d = (undefined1)((uint)(int)plVar15[3] >> 0x18);
          local_3b8._0_8_ = pcVar30;
        }
        else {
          lVar1 = *plVar18;
          local_3b8._16_4_ = (undefined4)lVar1;
          local_3b8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_3b8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_3b8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          local_3b8._0_8_ = (long *)*plVar15;
        }
        local_3b8._8_8_ = plVar15[1];
        *plVar15 = (long)plVar18;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_2f0._0_8_ = local_2f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"MethodDesc","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_358,(key_type *)local_2f0);
        std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
        if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,
                          CONCAT17(local_2f0[0x17],
                                   CONCAT16(local_2f0[0x16],
                                            CONCAT15(local_2f0[0x15],
                                                     CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) +
                          1);
        }
        if ((pointer)local_3b8._0_8_ != pcVar30) {
          operator_delete((void *)local_3b8._0_8_,
                          CONCAT17(local_3b8[0x17],
                                   CONCAT16(local_3b8[0x16],
                                            CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
        }
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_,
                          CONCAT17(local_388[0x17],
                                   CONCAT16(local_388[0x16],
                                            CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
        }
        if (local_320 != (undefined1  [8])local_310) {
          operator_delete((void *)local_320,
                          CONCAT17(local_310[0]._M_local_buf[7],
                                   CONCAT16(local_310[0]._M_local_buf[6],
                                            CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_310[0]._M_allocated_capacity)
                                           )) + 1);
        }
        if ((pointer)local_350._0_8_ != pcVar29) {
          operator_delete((void *)local_350._0_8_,
                          CONCAT17(local_350[0x17],
                                   CONCAT16(local_350[0x16],
                                            CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT17(local_2a0.field_2._M_local_buf[7],
                                   CONCAT16(local_2a0.field_2._M_local_buf[6],
                                            CONCAT24(local_2a0.field_2._M_allocated_capacity._4_2_,
                                                     local_2a0.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_1d8 = local_1d8 + 1;
      }
      pCVar22 = local_218;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_208,local_358);
      (*printer->_vptr_Printer[2])(printer,&local_208,"func (c *$ServiceUnexported$Client) ");
      local_3b8._20_2_ = 0x676e;
      local_3b8._16_4_ = 0x69646e45;
      local_3b8._8_8_ = 6;
      local_3b8[0x16] = '\0';
      local_3b8._0_8_ = local_3b8 + 0x10;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,(key_type *)local_3b8);
      std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x3641ea);
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_3b8,&local_208);
      GenerateClientMethodSignature
                ((Method *)pCVar22,printer,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_3b8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_3b8);
      (*printer->_vptr_Printer[5])(printer);
      (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[5])
                (&local_2c0,pCVar22);
      _Var10._M_p = local_2c0._M_dataplus._M_p;
      if (local_2c0._M_string_length == 0) {
        local_388._0_8_ = local_388 + 0x10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) {
          uStack_370 = (undefined3)local_2c0.field_2._8_8_;
          uStack_36d = (undefined1)((ulong)local_2c0.field_2._8_8_ >> 0x18);
          uStack_36c = (undefined2)((ulong)local_2c0.field_2._8_8_ >> 0x20);
          uStack_36a = (undefined1)((ulong)local_2c0.field_2._8_8_ >> 0x30);
          uStack_369 = (undefined1)((ulong)local_2c0.field_2._8_8_ >> 0x38);
        }
        else {
          local_388._0_8_ = local_2c0._M_dataplus._M_p;
        }
        local_388._17_2_ = local_2c0.field_2._M_allocated_capacity._1_2_;
        local_388[0x10] = local_2c0.field_2._M_local_buf[0];
        local_388[0x13] = local_2c0.field_2._M_local_buf[3];
        local_388[0x17] = local_2c0.field_2._M_local_buf[7];
        local_388._8_8_ = 0;
      }
      else {
        iVar12 = toupper((int)*local_2c0._M_dataplus._M_p);
        *_Var10._M_p = (char)iVar12;
        local_388._0_8_ = local_388 + 0x10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) {
          uStack_370 = (undefined3)local_2c0.field_2._8_8_;
          uStack_36d = (undefined1)((ulong)local_2c0.field_2._8_8_ >> 0x18);
          uStack_36c = (undefined2)((ulong)local_2c0.field_2._8_8_ >> 0x20);
          uStack_36a = (undefined1)((ulong)local_2c0.field_2._8_8_ >> 0x30);
          uStack_369 = (undefined1)((ulong)local_2c0.field_2._8_8_ >> 0x38);
        }
        else {
          local_388._0_8_ = local_2c0._M_dataplus._M_p;
        }
        local_388._17_2_ = local_2c0.field_2._M_allocated_capacity._1_2_;
        local_388[0x10] = local_2c0.field_2._M_local_buf[0];
        local_388[0x13] = local_2c0.field_2._M_local_buf[3];
        local_388[0x17] = local_2c0.field_2._M_local_buf[7];
        local_388._8_8_ = local_2c0._M_string_length;
      }
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_388 + 0x10);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      local_2c0._M_string_length = 0;
      local_2c0.field_2._M_local_buf[0] = '\0';
      local_350._20_2_ = 0x646f;
      local_350._16_4_ = 0x6874654d;
      local_350._8_8_ = 6;
      local_350[0x16] = '\0';
      local_388._20_2_ = local_2c0.field_2._M_allocated_capacity._4_2_;
      local_388[0x16] = local_2c0.field_2._M_local_buf[6];
      local_350._0_8_ = local_350 + 0x10;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,(key_type *)local_350);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_388);
      if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT17(local_350[0x17],
                                 CONCAT16(local_350[0x16],
                                          CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._0_8_ != paVar31) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT17(local_2c0.field_2._M_local_buf[7],
                                 CONCAT16(local_2c0.field_2._M_local_buf[6],
                                          CONCAT24(local_2c0.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_2c0.field_2._M_local_buf[3],
                                                            CONCAT21(local_2c0.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_2c0.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      local_350._0_8_ = local_350 + 0x10;
      local_350[0x18] = 't';
      local_350._25_2_ = 0x6f68;
      local_350[0x1b] = 'd';
      local_350._28_2_ = 0x4f49;
      local_350._16_4_ = 0x74737543;
      local_350._20_2_ = 0x6d6f;
      local_350[0x16] = 'M';
      local_350[0x17] = 'e';
      local_350._8_8_ = 0xe;
      local_350[0x1e] = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,(key_type *)local_350);
      iVar12 = std::__cxx11::string::compare((char *)pmVar14);
      if (iVar12 == 0) {
        (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0xb])
                  ((string *)local_388,pCVar22);
      }
      else {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        local_e0.field_2._8_6_ = 0x4f49646f6874;
        local_e0.field_2._M_allocated_capacity._0_6_ = 0x6d6f74737543;
        local_e0.field_2._M_allocated_capacity._6_2_ = 0x654d;
        local_e0._M_string_length = 0xe;
        local_e0.field_2._M_local_buf[0xe] = '\0';
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_208,&local_e0);
        pcVar29 = (pmVar14->_M_dataplus)._M_p;
        local_388._0_8_ = paVar31;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_388,pcVar29,pcVar29 + pmVar14->_M_string_length);
      }
      local_2a0.field_2._M_allocated_capacity._4_2_ = 0x7365;
      local_2a0.field_2._M_local_buf[6] = 't';
      local_2a0.field_2._M_allocated_capacity._0_4_ = 0x75716552;
      local_2a0._M_string_length = 7;
      local_2a0.field_2._7_4_ = local_2a0.field_2._7_4_ & 0xffffff00;
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,&local_2a0);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        CONCAT17(local_2a0.field_2._M_local_buf[7],
                                 CONCAT16(local_2a0.field_2._M_local_buf[6],
                                          CONCAT24(local_2a0.field_2._M_allocated_capacity._4_2_,
                                                   local_2a0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._0_8_ != paVar31) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((iVar12 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT26(local_e0.field_2._M_allocated_capacity._6_2_,
                                 local_e0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT17(local_350[0x17],
                                 CONCAT16(local_350[0x16],
                                          CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
      }
      (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0xd])
                (local_388,pCVar22);
      pCVar21 = (CommentHolder *)(local_350 + 0x10);
      local_350._16_4_ = 0x70736552;
      local_350._20_2_ = 0x6e6f;
      local_350[0x16] = 's';
      local_350[0x17] = 'e';
      local_350._8_8_ = 8;
      local_350[0x18] = '\0';
      local_350._0_8_ = pCVar21;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,(key_type *)local_350);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_388);
      pcVar33 = local_388 + 0x10;
      if ((CommentHolder *)local_350._0_8_ != pCVar21) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT17(local_350[0x17],
                                 CONCAT16(local_350[0x16],
                                          CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
      }
      if ((char *)local_388._0_8_ != pcVar33) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      local_2f0._24_2_ = 0x6572;
      local_2f0[0x1a] = 'f';
      local_2f0[0x1b] = 'i';
      local_2f0[0x1c] = 'x';
      local_2f0._16_4_ = 0x76726553;
      local_2f0[0x14] = 'i';
      local_2f0[0x15] = 'c';
      local_2f0[0x16] = 'e';
      local_2f0[0x17] = 'P';
      local_2f0._8_8_ = 0xd;
      local_2f0[0x1d] = '\0';
      local_2f0._0_8_ = local_2f0 + 0x10;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,(key_type *)local_2f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                     "/",pmVar14);
      local_270._0_8_ = local_270 + 0x10;
      local_270[0x14] = 'i';
      local_270._21_2_ = 0x6563;
      local_270._16_4_ = 0x76726553;
      local_270._8_8_ = 7;
      local_270[0x17] = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,(key_type *)local_270);
      puVar16 = (undefined8 *)
                std::__cxx11::string::_M_append(local_320,(ulong)(pmVar14->_M_dataplus)._M_p);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      pcVar25 = (char *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar25) {
        uVar2 = *(undefined8 *)pcVar25;
        uVar8 = puVar16[3];
        local_2a0.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar2;
        local_2a0.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_2a0.field_2._M_local_buf[6] = (char)((ulong)uVar2 >> 0x30);
        local_2a0.field_2._M_local_buf[7] = (char)((ulong)uVar2 >> 0x38);
        local_2a0.field_2._8_3_ = (undefined3)uVar8;
        local_2a0.field_2._M_local_buf[0xb] = (char)((ulong)uVar8 >> 0x18);
        local_2a0.field_2._12_2_ = (undefined2)((ulong)uVar8 >> 0x20);
        local_2a0.field_2._M_local_buf[0xe] = (char)((ulong)uVar8 >> 0x30);
        local_2a0.field_2._M_local_buf[0xf] = (char)((ulong)uVar8 >> 0x38);
      }
      else {
        uVar2 = *(undefined8 *)pcVar25;
        local_2a0.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar2;
        local_2a0.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_2a0.field_2._M_local_buf[6] = (char)((ulong)uVar2 >> 0x30);
        local_2a0.field_2._M_local_buf[7] = (char)((ulong)uVar2 >> 0x38);
        local_2a0._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_2a0._M_string_length = puVar16[1];
      *puVar16 = pcVar25;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
      pCVar19 = (CommentHolder *)(puVar16 + 2);
      if ((CommentHolder *)*puVar16 == pCVar19) {
        pp_Var3 = pCVar19->_vptr_CommentHolder;
        uVar2 = puVar16[3];
        local_350._16_4_ = SUB84(pp_Var3,0);
        local_350._20_2_ = (undefined2)((ulong)pp_Var3 >> 0x20);
        local_350[0x16] = (undefined1)((ulong)pp_Var3 >> 0x30);
        local_350[0x17] = (undefined1)((ulong)pp_Var3 >> 0x38);
        local_350[0x18] = (undefined1)uVar2;
        local_350._25_2_ = (undefined2)((ulong)uVar2 >> 8);
        local_350[0x1b] = (undefined1)((ulong)uVar2 >> 0x18);
        local_350._28_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_350[0x1e] = (undefined1)((ulong)uVar2 >> 0x30);
        local_350[0x1f] = (undefined1)((ulong)uVar2 >> 0x38);
        local_350._0_8_ = pCVar21;
      }
      else {
        pp_Var3 = pCVar19->_vptr_CommentHolder;
        local_350._16_4_ = SUB84(pp_Var3,0);
        local_350._20_2_ = (undefined2)((ulong)pp_Var3 >> 0x20);
        local_350[0x16] = (undefined1)((ulong)pp_Var3 >> 0x30);
        local_350[0x17] = (undefined1)((ulong)pp_Var3 >> 0x38);
        local_350._0_8_ = (CommentHolder *)*puVar16;
      }
      local_350._8_8_ = puVar16[1];
      *puVar16 = pCVar19;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238.field_2._M_allocated_capacity._4_2_ = 0x646f;
      local_238.field_2._M_allocated_capacity._0_4_ = 0x6874654d;
      local_238._M_string_length = 6;
      local_238.field_2._M_local_buf[6] = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,&local_238);
      puVar16 = (undefined8 *)
                std::__cxx11::string::_M_append(local_350,(ulong)(pmVar14->_M_dataplus)._M_p);
      pcVar25 = (char *)(puVar16 + 2);
      if ((char *)*puVar16 == pcVar25) {
        uVar2 = *(undefined8 *)pcVar25;
        uVar8 = puVar16[3];
        local_388._16_4_ = (undefined4)uVar2;
        local_388._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
        uStack_370 = (undefined3)uVar8;
        uStack_36d = (undefined1)((ulong)uVar8 >> 0x18);
        uStack_36c = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_36a = (undefined1)((ulong)uVar8 >> 0x30);
        uStack_369 = (undefined1)((ulong)uVar8 >> 0x38);
        local_388._0_8_ = pcVar33;
      }
      else {
        uVar2 = *(undefined8 *)pcVar25;
        local_388._16_4_ = (undefined4)uVar2;
        local_388._20_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)uVar2 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)uVar2 >> 0x38);
        local_388._0_8_ = (char *)*puVar16;
      }
      local_388._8_8_ = puVar16[1];
      *puVar16 = pcVar25;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      local_1a0.field_2._8_6_ = 0x656d614e646f;
      local_1a0.field_2._M_allocated_capacity._0_6_ = 0x654d6c6c7546;
      local_1a0.field_2._M_allocated_capacity._6_2_ = 0x6874;
      local_1a0._M_string_length = 0xe;
      local_1a0.field_2._M_local_buf[0xe] = '\0';
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_208,&local_1a0);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,
                        CONCAT26(local_1a0.field_2._M_allocated_capacity._6_2_,
                                 local_1a0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((char *)local_388._0_8_ != pcVar33) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT17(local_238.field_2._M_local_buf[7],
                                 CONCAT16(local_238.field_2._M_local_buf[6],
                                          CONCAT24(local_238.field_2._M_allocated_capacity._4_2_,
                                                   local_238.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((CommentHolder *)local_350._0_8_ != pCVar21) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT17(local_350[0x17],
                                 CONCAT16(local_350[0x16],
                                          CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        CONCAT17(local_2a0.field_2._M_local_buf[7],
                                 CONCAT16(local_2a0.field_2._M_local_buf[6],
                                          CONCAT24(local_2a0.field_2._M_allocated_capacity._4_2_,
                                                   local_2a0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,
                        CONCAT17(local_270[0x17],
                                 CONCAT25(local_270._21_2_,
                                          CONCAT14(local_270[0x14],local_270._16_4_))) + 1);
      }
      if (local_320 != (undefined1  [8])local_310) {
        operator_delete((void *)local_320,
                        CONCAT17(local_310[0]._M_local_buf[7],
                                 CONCAT16(local_310[0]._M_local_buf[6],
                                          CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_310[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,
                        CONCAT17(local_2f0[0x17],
                                 CONCAT16(local_2f0[0x16],
                                          CONCAT15(local_2f0[0x15],
                                                   CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) + 1
                       );
      }
      iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])
                         (pCVar22);
      if ((char)iVar12 == '\0') {
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        local_320 = (undefined1  [8])0x11;
        local_2a0._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_2a0,(ulong)local_320);
        local_2a0.field_2._M_allocated_capacity._0_4_ = local_320._0_4_;
        local_2a0.field_2._M_allocated_capacity._4_2_ = local_320._4_2_;
        local_2a0.field_2._M_local_buf[6] = local_320[6];
        local_2a0.field_2._M_local_buf[7] = local_320[7];
        *(undefined8 *)local_2a0._M_dataplus._M_p = 0x5565636976726553;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p + 8) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p + 10) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p + 0xb) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p + 0xc) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p + 0xd) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p + 0xe) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p + 0xf) = 'e';
        local_2a0._M_dataplus._M_p[0x10] = 'd';
        local_2a0._M_string_length = (size_type)local_320;
        local_2a0._M_dataplus._M_p[(long)local_320] = '\0';
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_208,&local_2a0);
        local_320 = (undefined1  [8])local_310;
        local_310[0]._M_allocated_capacity._4_2_ = 0x646f;
        local_310[0]._M_allocated_capacity._0_4_ = 0x6874654d;
        local_318 = (pointer)0x6;
        local_310[0]._M_local_buf[6] = '\0';
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_208,(key_type *)local_320);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_350,pmVar14,pmVar17);
        plVar15 = (long *)std::__cxx11::string::append((char *)local_350);
        plVar18 = plVar15 + 2;
        if ((long *)*plVar15 == plVar18) {
          lVar1 = *plVar18;
          lVar9 = plVar15[3];
          local_388._16_4_ = (undefined4)lVar1;
          local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          uStack_370 = (undefined3)lVar9;
          uStack_36d = (undefined1)((ulong)lVar9 >> 0x18);
          uStack_36c = (undefined2)((ulong)lVar9 >> 0x20);
          uStack_36a = (undefined1)((ulong)lVar9 >> 0x30);
          uStack_369 = (undefined1)((ulong)lVar9 >> 0x38);
          local_388._0_8_ = local_388 + 0x10;
        }
        else {
          lVar1 = *plVar18;
          local_388._16_4_ = (undefined4)lVar1;
          local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
          local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
          local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
          local_388._0_8_ = (long *)*plVar15;
        }
        local_388._8_8_ = plVar15[1];
        *plVar15 = (long)plVar18;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_2f0._16_4_ = 0x65727453;
        local_2f0[0x14] = 'a';
        local_2f0[0x15] = 'm';
        local_2f0[0x16] = 'T';
        local_2f0[0x17] = 'y';
        local_2f0._24_2_ = 0x6570;
        local_2f0._8_8_ = 10;
        local_2f0[0x1a] = '\0';
        local_2f0._0_8_ = local_2f0 + 0x10;
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_208,(key_type *)local_2f0);
        std::__cxx11::string::operator=((string *)pmVar14,(string *)local_388);
        if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,
                          CONCAT17(local_2f0[0x17],
                                   CONCAT16(local_2f0[0x16],
                                            CONCAT15(local_2f0[0x15],
                                                     CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) +
                          1);
        }
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_,
                          CONCAT17(local_388[0x17],
                                   CONCAT16(local_388[0x16],
                                            CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
        }
        if ((CommentHolder *)local_350._0_8_ != (CommentHolder *)(local_350 + 0x10)) {
          operator_delete((void *)local_350._0_8_,
                          CONCAT17(local_350[0x17],
                                   CONCAT16(local_350[0x16],
                                            CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
        }
        if (local_320 != (undefined1  [8])local_310) {
          operator_delete((void *)local_320,
                          CONCAT17(local_310[0]._M_local_buf[7],
                                   CONCAT16(local_310[0]._M_local_buf[6],
                                            CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_310[0]._M_allocated_capacity)
                                           )) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT17(local_2a0.field_2._M_local_buf[7],
                                   CONCAT16(local_2a0.field_2._M_local_buf[6],
                                            CONCAT24(local_2a0.field_2._M_allocated_capacity._4_2_,
                                                     local_2a0.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        (*printer->_vptr_Printer[2])
                  (printer,&local_208,
                   "stream, err := c.cc.NewStream(ctx, &$MethodDesc$, \"$FullMethodName$\", opts...)\n"
                  );
        local_388._16_4_ = 0x6f727245;
        local_388._20_2_ = 0x5f72;
        local_388[0x16] = 'C';
        stack0xfffffffffffffc8f = 0x6b636568;
        local_388._8_8_ = 0xb;
        uStack_36d = '\0';
        local_388._0_8_ = local_388 + 0x10;
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_208,(key_type *)local_388);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x386b44);
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_,
                          CONCAT17(local_388[0x17],
                                   CONCAT16(local_388[0x16],
                                            CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_388,&local_208);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_388,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_388);
        (*printer->_vptr_Printer[2])(printer,&local_208,"x := &$StreamType${stream}\n");
        iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                           (pCVar22);
        if ((char)iVar12 == '\0') {
          iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                             (pCVar22);
          if ((char)iVar12 != '\0') {
            local_350._16_4_ = 0x6f727245;
            local_350._20_2_ = 0x5f72;
            local_350[0x16] = 'C';
            local_350[0x17] = 'h';
            local_350[0x18] = 'e';
            local_350._25_2_ = 0x6b63;
            local_350._8_8_ = 0xb;
            local_350[0x1b] = '\0';
            local_350._0_8_ = (CommentHolder *)(local_350 + 0x10);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_208,(key_type *)local_350);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x386af3);
            if ((CommentHolder *)local_350._0_8_ != (CommentHolder *)(local_350 + 0x10)) {
              operator_delete((void *)local_350._0_8_,
                              CONCAT17(local_350[0x17],
                                       CONCAT16(local_350[0x16],
                                                CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_350,&local_208);
            GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_350,true);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_350);
            local_2a0.field_2._M_allocated_capacity._0_4_ = 0x6f727245;
            local_2a0.field_2._M_allocated_capacity._4_2_ = 0x5f72;
            local_2a0.field_2._M_local_buf[6] = 'C';
            local_2a0.field_2._7_4_ = 0x6b636568;
            local_2a0._M_string_length = 0xb;
            local_2a0.field_2._M_local_buf[0xb] = '\0';
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_208,&local_2a0);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x386b21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,
                              CONCAT17(local_2a0.field_2._M_local_buf[7],
                                       CONCAT16(local_2a0.field_2._M_local_buf[6],
                                                CONCAT24(local_2a0.field_2._M_allocated_capacity.
                                                         _4_2_,local_2a0.field_2.
                                                               _M_allocated_capacity._0_4_))) + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_2a0,&local_208);
            GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_2a0,true);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_2a0);
          }
        }
        (*printer->_vptr_Printer[3])(printer,"return x, nil\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])
                           (pCVar22);
        bVar32 = 1;
        if ((char)iVar12 == '\0') {
          iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                             (pCVar22);
          if ((char)iVar12 == '\0') {
            bVar32 = 0;
          }
          else {
            iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                               (pCVar22);
            bVar32 = (byte)iVar12 ^ 1;
          }
        }
        iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])
                           (pCVar22);
        cVar11 = '\x01';
        if ((char)iVar12 == '\0') {
          iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                             (pCVar22);
          if ((char)iVar12 == '\0') {
            iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                               (pCVar22);
            cVar11 = (char)iVar12;
          }
          else {
            cVar11 = '\0';
          }
        }
        iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                           (pCVar22);
        if ((char)iVar12 == '\0') {
          bVar28 = 0;
        }
        else {
          iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                             (pCVar22);
          bVar28 = (byte)iVar12 ^ 1;
        }
        (*printer->_vptr_Printer[2])
                  (printer,&local_208,"type $Service$_$Method$Client interface {\n");
        (*printer->_vptr_Printer[5])(printer);
        if (bVar32 != 0) {
          (*printer->_vptr_Printer[2])(printer,&local_208,"Send(*$Request$) error\n");
        }
        if (cVar11 != '\0') {
          (*printer->_vptr_Printer[2])(printer,&local_208,"Recv() (*$Response$, error)\n");
        }
        if (bVar28 != 0) {
          (*printer->_vptr_Printer[2])(printer,&local_208,"CloseAndRecv() (*$Response$, error)\n");
        }
        (*printer->_vptr_Printer[2])(printer,&local_208,"$grpc$.ClientStream\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        (*printer->_vptr_Printer[2])(printer,&local_208,"type $StreamType$ struct {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,&local_208,"$grpc$.ClientStream\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        if (bVar32 != 0) {
          (*printer->_vptr_Printer[2])
                    (printer,&local_208,"func (x *$StreamType$) Send(m *$Request$) error {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[3])(printer,"return x.ClientStream.SendMsg(m)\n");
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n\n");
        }
        if (cVar11 != '\0') {
          (*printer->_vptr_Printer[2])
                    (printer,&local_208,"func (x *$StreamType$) Recv() (*$Response$, error) {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[2])(printer,&local_208,"m := new($Response$)\n");
          local_310[0]._M_allocated_capacity._0_4_ = 0x6f727245;
          local_310[0]._M_allocated_capacity._4_2_ = 0x5f72;
          local_310[0]._M_local_buf[6] = 'C';
          local_310[0]._M_local_buf[7] = 'h';
          local_310[0]._M_local_buf[8] = 'e';
          local_310[0]._9_2_ = 0x6b63;
          local_318 = (pointer)0xb;
          local_310[0]._M_local_buf[0xb] = '\0';
          local_320 = (undefined1  [8])local_310;
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_208,(key_type *)local_320);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x386c98);
          if (local_320 != (undefined1  [8])local_310) {
            operator_delete((void *)local_320,
                            CONCAT17(local_310[0]._M_local_buf[7],
                                     CONCAT16(local_310[0]._M_local_buf[6],
                                              CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_310[0]._M_allocated_capacity))) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_320,&local_208);
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_320,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_320);
          (*printer->_vptr_Printer[3])(printer,"return m, nil\n");
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n\n");
        }
        if (bVar28 != 0) {
          (*printer->_vptr_Printer[2])
                    (printer,&local_208,
                     "func (x *$StreamType$) CloseAndRecv() (*$Response$, error) {\n");
          (*printer->_vptr_Printer[5])(printer);
          local_2f0._0_8_ = local_2f0 + 0x10;
          local_2f0._16_4_ = 0x6f727245;
          local_2f0[0x14] = 'r';
          local_2f0[0x15] = '_';
          local_2f0[0x16] = 'C';
          local_2f0[0x17] = 'h';
          local_2f0._24_2_ = 0x6365;
          local_2f0[0x1a] = 'k';
          local_2f0._8_8_ = 0xb;
          local_2f0[0x1b] = '\0';
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_208,(key_type *)local_2f0);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x386b21);
          if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
            operator_delete((void *)local_2f0._0_8_,
                            CONCAT17(local_2f0[0x17],
                                     CONCAT16(local_2f0[0x16],
                                              CONCAT15(local_2f0[0x15],
                                                       CONCAT14(local_2f0[0x14],local_2f0._16_4_))))
                            + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_2f0,&local_208);
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_2f0,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_2f0);
          (*printer->_vptr_Printer[2])(printer,&local_208,"m := new($Response$)\n");
          local_270._0_8_ = local_270 + 0x10;
          local_270._16_4_ = 0x6f727245;
          local_270[0x14] = 'r';
          local_270._21_2_ = 0x435f;
          local_270[0x17] = 'h';
          local_270._24_2_ = 0x6365;
          local_270[0x1a] = 'k';
          local_270._8_8_ = 0xb;
          local_270[0x1b] = '\0';
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_208,(key_type *)local_270);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x386c98);
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,
                            CONCAT17(local_270[0x17],
                                     CONCAT25(local_270._21_2_,
                                              CONCAT14(local_270[0x14],local_270._16_4_))) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_270,&local_208);
          p_Var27 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_270;
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)p_Var27,true);
          pcVar33 = "return m, nil\n";
          goto LAB_00340086;
        }
      }
      else {
        (*printer->_vptr_Printer[2])(printer,&local_208,"out := new($Response$)\n");
        (*printer->_vptr_Printer[2])
                  (printer,&local_208,
                   "err := c.cc.Invoke(ctx, \"$FullMethodName$\", in, out, opts...)\n");
        local_388._16_4_ = 0x6f727245;
        local_388._20_2_ = 0x5f72;
        local_388[0x16] = 'C';
        stack0xfffffffffffffc8f = 0x6b636568;
        local_388._8_8_ = 0xb;
        uStack_36d = '\0';
        local_388._0_8_ = local_388 + 0x10;
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_208,(key_type *)local_388);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x386b44);
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_,
                          CONCAT17(local_388[0x17],
                                   CONCAT16(local_388[0x16],
                                            CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_388,&local_208);
        p_Var27 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_388;
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)p_Var27,true);
        pcVar33 = "return out, nil\n";
LAB_00340086:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(p_Var27);
        (*printer->_vptr_Printer[3])(printer,pcVar33);
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_208);
      if (local_218 != (CommentHolder *)0x0) {
        (*((CommentHolder *)&local_218->_vptr_CommentHolder)->_vptr_CommentHolder[1])();
      }
      pSVar34 = local_240;
      iVar12 = local_20c + 1;
      iVar13 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
    } while (iVar12 < iVar13);
  }
  p_Var27 = local_358;
  pCVar22 = (CommentHolder *)(local_3b8 + 0x10);
  (*printer->_vptr_Printer[2])(printer,local_358,"// Server API for $Service$ service\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type $Service$Server interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  local_3b8._0_8_ = pCVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Ending","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_3b8);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x36cd50);
  if ((CommentHolder *)local_3b8._0_8_ != pCVar22) {
    operator_delete((void *)local_3b8._0_8_,
                    CONCAT17(local_3b8[0x17],
                             CONCAT16(local_3b8[0x16],CONCAT24(local_3b8._20_2_,local_3b8._16_4_)))
                    + 1);
  }
  pSVar34 = local_240;
  iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
  if (0 < iVar12) {
    uVar24 = 0;
    do {
      (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[9])(local_3b8,pSVar34,uVar24);
      uVar2 = local_3b8._0_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_90,local_358);
      GenerateServerMethodSignature
                ((Method *)uVar2,printer,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_90);
      if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)0x0) {
        (*(*(_func_int ***)local_3b8._0_8_)[1])();
      }
      pSVar34 = local_240;
      uVar23 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar23;
      iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
    } while ((int)uVar23 < iVar12);
  }
  p_Var27 = local_358;
  (*printer->_vptr_Printer[2])(printer,local_358,"mustEmbedUnimplemented$Service$Server()\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type Unimplemented$Service$Server struct {\n");
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  local_3b8._0_8_ = pCVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Ending","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var27,(key_type *)local_3b8);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x3641ea);
  if ((CommentHolder *)local_3b8._0_8_ != pCVar22) {
    operator_delete((void *)local_3b8._0_8_,
                    CONCAT17(local_3b8[0x17],
                             CONCAT16(local_3b8[0x16],CONCAT24(local_3b8._20_2_,local_3b8._16_4_)))
                    + 1);
  }
  pSVar34 = local_240;
  iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
  if (0 < iVar12) {
    uVar24 = 0;
    do {
      (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[9])(local_350,pSVar34,uVar24);
      (*(*(_func_int ***)local_350._0_8_)[5])(&local_140);
      pcVar33 = local_140;
      uVar5 = stack0xfffffffffffffc5f;
      if (local_138 == 0) {
        local_3b8._0_8_ = local_3b8 + 0x10;
        local_3b8[0x16] = (undefined1)((uint7)uStack_12f >> 0x28);
        local_3b8[0x17] = (undefined1)((uint7)uStack_12f >> 0x30);
        local_3b8._20_2_ = (undefined2)((uint7)uStack_12f >> 0x18);
        if (local_140 == &local_130) {
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_12f,local_130);
          uStack_3a0 = (undefined3)uStack_128;
          uStack_39d = (undefined1)((ulong)uStack_128 >> 0x18);
          uStack_39c = (undefined4)((ulong)uStack_128 >> 0x20);
        }
        else {
          local_3b8._0_8_ = local_140;
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_12f,local_130);
          uStack_3a0 = SUB43(uVar5,1);
        }
        local_3b8._8_8_ = 0;
      }
      else {
        iVar12 = toupper((int)*local_140);
        uVar5 = stack0xfffffffffffffc5f;
        *pcVar33 = (char)iVar12;
        local_3b8._0_8_ = local_3b8 + 0x10;
        local_3b8[0x16] = (undefined1)((uint7)uStack_12f >> 0x28);
        local_3b8[0x17] = (undefined1)((uint7)uStack_12f >> 0x30);
        local_3b8._20_2_ = (undefined2)((uint7)uStack_12f >> 0x18);
        if (local_140 == &local_130) {
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_12f,local_130);
          uStack_3a0 = (undefined3)uStack_128;
          uStack_39d = (undefined1)((ulong)uStack_128 >> 0x18);
          uStack_39c = (undefined4)((ulong)uStack_128 >> 0x20);
        }
        else {
          local_3b8._0_8_ = local_140;
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_12f,local_130);
          uStack_3a0 = SUB43(uVar5,1);
        }
        local_3b8._8_8_ = local_138;
      }
      local_140 = &local_130;
      local_138 = 0;
      local_130 = '\0';
      local_388._0_8_ = local_388 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Method","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)p_Var27,(key_type *)local_388);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
      }
      cVar11 = (**(code **)((long)*(CommentHolder *)local_350._0_8_ + 0x78))();
      pcVar33 = "";
      if (cVar11 != '\0') {
        pcVar33 = "nil, ";
      }
      local_3b8._0_8_ = local_3b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Nil","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,(key_type *)local_3b8);
      std::__cxx11::string::_M_replace
                ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,(ulong)pcVar33);
      if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      (*printer->_vptr_Printer[2])(printer,local_358,"func (Unimplemented$Service$Server) ");
      uVar2 = local_350._0_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_c0,local_358);
      GenerateServerMethodSignature
                ((Method *)uVar2,printer,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_c0);
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])
                (printer,local_358,
                 "return $Nil$status.Errorf(codes.Unimplemented, \"method $Method$ not implemented\")\n"
                );
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n");
      (*printer->_vptr_Printer[3])(printer,"\n");
      if ((CommentHolder *)local_350._0_8_ != (CommentHolder *)0x0) {
        (*(*(_func_int ***)local_350._0_8_)[1])();
      }
      pSVar34 = local_240;
      uVar23 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar23;
      iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
      p_Var27 = local_358;
    } while ((int)uVar23 < iVar12);
  }
  (*printer->_vptr_Printer[2])
            (printer,p_Var27,
             "func (Unimplemented$Service$Server) mustEmbedUnimplemented$Service$Server() {}");
  (*printer->_vptr_Printer[3])(printer,"\n\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"type Unsafe$Service$Server interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"mustEmbedUnimplemented$Service$Server()\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])
            (printer,p_Var27,
             "func Register$Service$Server(s $grpc$.ServiceRegistrar, srv $Service$Server) {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"s.RegisterService(&$ServiceDesc$, srv)\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  iVar12 = (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[8])(pSVar34);
  if (0 < iVar12) {
    iVar12 = 0;
    do {
      local_20c = iVar12;
      (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[9])(&local_218,pSVar34);
      pCVar22 = local_218;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_1d0,p_Var27);
      (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[5])(local_350,pCVar22)
      ;
      uVar2 = local_350._0_8_;
      if (local_350._8_8_ == 0) {
        local_3b8._0_8_ = local_3b8 + 0x10;
        if ((CommentHolder *)local_350._0_8_ == (CommentHolder *)(local_350 + 0x10)) {
          uStack_3a0 = CONCAT21(local_350._25_2_,local_350[0x18]);
          uStack_39c = CONCAT13(local_350[0x1f],CONCAT12(local_350[0x1e],local_350._28_2_));
          uStack_39d = local_350[0x1b];
        }
        else {
          local_3b8._0_8_ = local_350._0_8_;
        }
        local_3b8[0x17] = local_350[0x17];
        local_3b8._8_8_ = 0;
      }
      else {
        iVar12 = toupper((int)*(char *)local_350._0_8_);
        *(char *)uVar2 = (char)iVar12;
        local_3b8._0_8_ = local_3b8 + 0x10;
        if ((CommentHolder *)local_350._0_8_ == (CommentHolder *)(local_350 + 0x10)) {
          uStack_3a0 = CONCAT21(local_350._25_2_,local_350[0x18]);
          uStack_39c = CONCAT13(local_350[0x1f],CONCAT12(local_350[0x1e],local_350._28_2_));
          uStack_39d = local_350[0x1b];
        }
        else {
          local_3b8._0_8_ = local_350._0_8_;
        }
        local_3b8[0x17] = local_350[0x17];
        local_3b8._8_8_ = local_350._8_8_;
      }
      local_3b8._16_4_ = local_350._16_4_;
      local_350._8_8_ = 0;
      local_350._16_4_ = local_350._16_4_ & 0xffffff00;
      local_388._20_2_ = 0x646f;
      local_388._16_4_ = 0x6874654d;
      local_388._8_8_ = 6;
      local_388[0x16] = '\0';
      local_3b8._20_2_ = local_350._20_2_;
      local_3b8[0x16] = local_350[0x16];
      local_388._0_8_ = local_388 + 0x10;
      local_350._0_8_ = (CommentHolder *)(local_350 + 0x10);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,(key_type *)local_388);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      if ((CommentHolder *)local_350._0_8_ != (CommentHolder *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT17(local_350[0x17],
                                 CONCAT16(local_350[0x16],
                                          CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
      }
      (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0xb])
                (local_3b8,pCVar22);
      local_388._20_2_ = 0x7365;
      local_388[0x16] = 't';
      local_388._16_4_ = 0x75716552;
      local_388._8_8_ = 7;
      stack0xfffffffffffffc8f = stack0xfffffffffffffc8f & 0xffffff00;
      local_388._0_8_ = local_388 + 0x10;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,(key_type *)local_388);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      local_388._0_8_ = local_388 + 0x10;
      uStack_36d = 'd';
      uStack_36c = 0x4f49;
      local_388._16_4_ = 0x74737543;
      local_388._20_2_ = 0x6d6f;
      local_388[0x16] = 'M';
      stack0xfffffffffffffc8f = 0x6f687465;
      local_388._8_8_ = 0xe;
      uStack_36a = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,(key_type *)local_388);
      iVar12 = std::__cxx11::string::compare((char *)pmVar14);
      if (iVar12 == 0) {
        (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0xd])
                  (local_3b8,pCVar22);
      }
      else {
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        local_2a0.field_2._M_local_buf[0xb] = 'd';
        local_2a0.field_2._12_2_ = 0x4f49;
        local_2a0.field_2._M_allocated_capacity._0_4_ = 0x74737543;
        local_2a0.field_2._M_allocated_capacity._4_2_ = 0x6d6f;
        local_2a0.field_2._M_local_buf[6] = 'M';
        local_2a0.field_2._7_4_ = 0x6f687465;
        local_2a0._M_string_length = 0xe;
        local_2a0.field_2._M_local_buf[0xe] = '\0';
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d0,&local_2a0);
        local_3b8._0_8_ = local_3b8 + 0x10;
        pcVar29 = (pmVar14->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3b8,pcVar29,pcVar29 + pmVar14->_M_string_length);
      }
      local_310[0]._M_allocated_capacity._0_4_ = 0x70736552;
      local_310[0]._M_allocated_capacity._4_2_ = 0x6e6f;
      local_310[0]._M_local_buf[6] = 's';
      local_310[0]._M_local_buf[7] = 'e';
      local_318 = (pointer)0x8;
      local_310[0]._M_local_buf[8] = '\0';
      local_320 = (undefined1  [8])local_310;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,(key_type *)local_320);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if (local_320 != (undefined1  [8])local_310) {
        operator_delete((void *)local_320,
                        CONCAT17(local_310[0]._M_local_buf[7],
                                 CONCAT16(local_310[0]._M_local_buf[6],
                                          CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_310[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      paVar31 = &local_2c0.field_2;
      if ((iVar12 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2)) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        CONCAT17(local_2a0.field_2._M_local_buf[7],
                                 CONCAT16(local_2a0.field_2._M_local_buf[6],
                                          CONCAT24(local_2a0.field_2._M_allocated_capacity._4_2_,
                                                   local_2a0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      local_270._0_8_ = local_270 + 0x10;
      local_270._24_2_ = 0x6572;
      local_270[0x1a] = 'f';
      local_270[0x1b] = 'i';
      local_270[0x1c] = 'x';
      local_270._16_4_ = 0x76726553;
      local_270[0x14] = 'i';
      local_270._21_2_ = 0x6563;
      local_270[0x17] = 'P';
      local_270._8_8_ = 0xd;
      local_270[0x1d] = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,(key_type *)local_270);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                     "/",pmVar14);
      local_2c0.field_2._M_allocated_capacity._4_2_ = 0x6369;
      local_2c0.field_2._M_local_buf[6] = 'e';
      local_2c0.field_2._M_local_buf[0] = 'S';
      local_2c0.field_2._M_allocated_capacity._1_2_ = 0x7265;
      local_2c0.field_2._M_local_buf[3] = 'v';
      local_2c0._M_string_length = 7;
      local_2c0.field_2._M_local_buf[7] = '\0';
      local_2c0._M_dataplus._M_p = (pointer)paVar31;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,&local_2c0);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  (local_2f0,(ulong)(pmVar14->_M_dataplus)._M_p);
      local_320 = (undefined1  [8])local_310;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 == paVar20) {
        sVar4 = paVar20->_M_allocated_capacity;
        lVar1 = plVar15[3];
        local_310[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_310[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_310[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_310[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_310[0]._M_local_buf[8] = (undefined1)lVar1;
        local_310[0]._9_2_ = (undefined2)((ulong)lVar1 >> 8);
        local_310[0]._M_local_buf[0xb] = (undefined1)((ulong)lVar1 >> 0x18);
        local_310[0]._12_4_ = (undefined4)((ulong)lVar1 >> 0x20);
      }
      else {
        sVar4 = paVar20->_M_allocated_capacity;
        local_310[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_310[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_310[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_310[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_320 = (undefined1  [8])*plVar15;
      }
      local_318 = (pointer)plVar15[1];
      *plVar15 = (long)paVar20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_320);
      local_388._0_8_ = local_388 + 0x10;
      plVar18 = plVar15 + 2;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      if ((long *)*plVar15 == plVar18) {
        lVar1 = *plVar18;
        lVar9 = plVar15[3];
        local_388._16_4_ = (undefined4)lVar1;
        local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_370 = (undefined3)lVar9;
        uStack_36d = (undefined1)((ulong)lVar9 >> 0x18);
        uStack_36c = (undefined2)((ulong)lVar9 >> 0x20);
        uStack_36a = (undefined1)((ulong)lVar9 >> 0x30);
        uStack_369 = (undefined1)((ulong)lVar9 >> 0x38);
      }
      else {
        lVar1 = *plVar18;
        local_388._16_4_ = (undefined4)lVar1;
        local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_388._0_8_ = (long *)*plVar15;
      }
      local_388._8_8_ = plVar15[1];
      *plVar15 = (long)plVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      local_238.field_2._M_allocated_capacity._4_2_ = 0x646f;
      local_238.field_2._M_allocated_capacity._0_4_ = 0x6874654d;
      local_238._M_string_length = 6;
      local_238.field_2._M_local_buf[6] = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,&local_238);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  (local_388,(ulong)(pmVar14->_M_dataplus)._M_p);
      local_3b8._0_8_ = local_3b8 + 0x10;
      plVar18 = plVar15 + 2;
      if ((long *)*plVar15 == plVar18) {
        lVar1 = *plVar18;
        lVar9 = plVar15[3];
        local_3b8._16_4_ = (undefined4)lVar1;
        local_3b8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3b8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3b8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_3a0 = (undefined3)lVar9;
        uStack_39d = (undefined1)((ulong)lVar9 >> 0x18);
        uStack_39c = (undefined4)((ulong)lVar9 >> 0x20);
      }
      else {
        lVar1 = *plVar18;
        local_3b8._16_4_ = (undefined4)lVar1;
        local_3b8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3b8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3b8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_3b8._0_8_ = (long *)*plVar15;
      }
      local_3b8._8_8_ = plVar15[1];
      *plVar15 = (long)plVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      local_1a0.field_2._8_6_ = 0x656d614e646f;
      local_1a0.field_2._M_allocated_capacity._0_6_ = 0x654d6c6c7546;
      local_1a0.field_2._M_allocated_capacity._6_2_ = 0x6874;
      local_1a0._M_string_length = 0xe;
      local_1a0.field_2._M_local_buf[0xe] = '\0';
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,&local_1a0);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,
                        CONCAT26(local_1a0.field_2._M_allocated_capacity._6_2_,
                                 local_1a0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT17(local_238.field_2._M_local_buf[7],
                                 CONCAT16(local_238.field_2._M_local_buf[6],
                                          CONCAT24(local_238.field_2._M_allocated_capacity._4_2_,
                                                   local_238.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if (local_320 != (undefined1  [8])local_310) {
        operator_delete((void *)local_320,
                        CONCAT17(local_310[0]._M_local_buf[7],
                                 CONCAT16(local_310[0]._M_local_buf[6],
                                          CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_310[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar31) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT17(local_2c0.field_2._M_local_buf[7],
                                 CONCAT16(local_2c0.field_2._M_local_buf[6],
                                          CONCAT24(local_2c0.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_2c0.field_2._M_local_buf[3],
                                                            CONCAT21(local_2c0.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_2c0.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,
                        CONCAT17(local_2f0[0x17],
                                 CONCAT16(local_2f0[0x16],
                                          CONCAT15(local_2f0[0x15],
                                                   CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) + 1
                       );
      }
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,
                        CONCAT17(local_270[0x17],
                                 CONCAT25(local_270._21_2_,
                                          CONCAT14(local_270[0x14],local_270._16_4_))) + 1);
      }
      local_270._0_8_ = local_270 + 0x10;
      local_270[0x14] = 'i';
      local_270._21_2_ = 0x6563;
      local_270._16_4_ = 0x76726553;
      local_270._8_8_ = 7;
      local_270[0x17] = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,(key_type *)local_270);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                     "_",pmVar14);
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)local_2f0);
      local_320 = (undefined1  [8])local_310;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar20) {
        sVar4 = paVar20->_M_allocated_capacity;
        uVar2 = puVar16[3];
        local_310[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_310[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_310[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_310[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_310[0]._M_local_buf[8] = (undefined1)uVar2;
        local_310[0]._9_2_ = (undefined2)((ulong)uVar2 >> 8);
        local_310[0]._M_local_buf[0xb] = (undefined1)((ulong)uVar2 >> 0x18);
        local_310[0]._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
      }
      else {
        sVar4 = paVar20->_M_allocated_capacity;
        local_310[0]._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        local_310[0]._M_allocated_capacity._4_2_ = (undefined2)(sVar4 >> 0x20);
        local_310[0]._M_local_buf[6] = (undefined1)(sVar4 >> 0x30);
        local_310[0]._M_local_buf[7] = (undefined1)(sVar4 >> 0x38);
        local_320 = (undefined1  [8])*puVar16;
      }
      local_318 = (pointer)puVar16[1];
      *puVar16 = paVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      local_2c0.field_2._M_allocated_capacity._4_2_ = 0x646f;
      local_2c0.field_2._M_local_buf[0] = 'M';
      local_2c0.field_2._M_allocated_capacity._1_2_ = 0x7465;
      local_2c0.field_2._M_local_buf[3] = 'h';
      local_2c0._M_string_length = 6;
      local_2c0.field_2._M_local_buf[6] = '\0';
      local_2c0._M_dataplus._M_p = (pointer)paVar31;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,&local_2c0);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  (local_320,(ulong)(pmVar14->_M_dataplus)._M_p);
      plVar18 = plVar15 + 2;
      if ((long *)*plVar15 == plVar18) {
        lVar1 = *plVar18;
        lVar9 = plVar15[3];
        local_388._16_4_ = (undefined4)lVar1;
        local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_370 = (undefined3)lVar9;
        uStack_36d = (undefined1)((ulong)lVar9 >> 0x18);
        uStack_36c = (undefined2)((ulong)lVar9 >> 0x20);
        uStack_36a = (undefined1)((ulong)lVar9 >> 0x30);
        uStack_369 = (undefined1)((ulong)lVar9 >> 0x38);
        local_388._0_8_ = local_388 + 0x10;
      }
      else {
        lVar1 = *plVar18;
        local_388._16_4_ = (undefined4)lVar1;
        local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_388._0_8_ = (long *)*plVar15;
      }
      local_388._8_8_ = plVar15[1];
      *plVar15 = (long)plVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_388);
      p_Var27 = local_358;
      local_3b8._0_8_ = local_3b8 + 0x10;
      plVar18 = plVar15 + 2;
      if ((long *)*plVar15 == plVar18) {
        lVar1 = *plVar18;
        lVar9 = plVar15[3];
        local_3b8._16_4_ = (undefined4)lVar1;
        local_3b8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3b8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3b8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_3a0 = (undefined3)lVar9;
        uStack_39d = (undefined1)((ulong)lVar9 >> 0x18);
        uStack_39c = (undefined4)((ulong)lVar9 >> 0x20);
      }
      else {
        lVar1 = *plVar18;
        local_3b8._16_4_ = (undefined4)lVar1;
        local_3b8._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_3b8[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_3b8[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_3b8._0_8_ = (long *)*plVar15;
      }
      local_3b8._8_8_ = plVar15[1];
      *plVar15 = (long)plVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      local_238.field_2._M_allocated_capacity._4_2_ = 0x656c;
      local_238.field_2._M_local_buf[6] = 'r';
      local_238.field_2._M_allocated_capacity._0_4_ = 0x646e6148;
      local_238._M_string_length = 7;
      local_238.field_2._M_local_buf[7] = '\0';
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1d0,&local_238);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT17(local_238.field_2._M_local_buf[7],
                                 CONCAT16(local_238.field_2._M_local_buf[6],
                                          CONCAT24(local_238.field_2._M_allocated_capacity._4_2_,
                                                   local_238.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar31) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT17(local_2c0.field_2._M_local_buf[7],
                                 CONCAT16(local_2c0.field_2._M_local_buf[6],
                                          CONCAT24(local_2c0.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_2c0.field_2._M_local_buf[3],
                                                            CONCAT21(local_2c0.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_2c0.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      if (local_320 != (undefined1  [8])local_310) {
        operator_delete((void *)local_320,
                        CONCAT17(local_310[0]._M_local_buf[7],
                                 CONCAT16(local_310[0]._M_local_buf[6],
                                          CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_310[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,
                        CONCAT17(local_2f0[0x17],
                                 CONCAT16(local_2f0[0x16],
                                          CONCAT15(local_2f0[0x15],
                                                   CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) + 1
                       );
      }
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,
                        CONCAT17(local_270[0x17],
                                 CONCAT25(local_270._21_2_,
                                          CONCAT14(local_270[0x14],local_270._16_4_))) + 1);
      }
      iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])
                         (pCVar22);
      if ((char)iVar12 == '\0') {
        local_320 = (undefined1  [8])local_310;
        local_2f0._0_8_ = (pointer)0x11;
        local_320 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_320,(ulong)local_2f0);
        local_310[0]._M_allocated_capacity._0_4_ = (undefined4)local_2f0._0_8_;
        local_310[0]._M_allocated_capacity._4_2_ = SUB82(local_2f0._0_8_,4);
        local_310[0]._M_local_buf[6] = SUB81(local_2f0._0_8_,6);
        local_310[0]._M_local_buf[7] = SUB81(local_2f0._0_8_,7);
        *(undefined8 *)local_320 = 0x5565636976726553;
        *(char *)((long)local_320 + 8) = 'n';
        *(char *)((long)local_320 + 9) = 'e';
        *(char *)((long)local_320 + 10) = 'x';
        *(char *)((long)local_320 + 0xb) = 'p';
        *(char *)((long)local_320 + 0xc) = 'o';
        *(char *)((long)local_320 + 0xd) = 'r';
        *(char *)((long)local_320 + 0xe) = 't';
        *(char *)((long)local_320 + 0xf) = 'e';
        *(char *)((long)local_320 + 0x10) = 'd';
        local_318 = (pointer)local_2f0._0_8_;
        *(char *)((long)local_320 + local_2f0._0_8_) = '\0';
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d0,(key_type *)local_320);
        local_2f0._0_8_ = local_2f0 + 0x10;
        local_2f0[0x14] = 'o';
        local_2f0[0x15] = 'd';
        local_2f0._16_4_ = 0x6874654d;
        local_2f0._8_8_ = 6;
        local_2f0[0x16] = '\0';
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d0,(key_type *)local_2f0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_388,pmVar14,pmVar17);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)local_388);
        local_3b8._0_8_ = local_3b8 + 0x10;
        pCVar21 = (CommentHolder *)(puVar16 + 2);
        if ((CommentHolder *)*puVar16 == pCVar21) {
          pp_Var3 = ((CommentHolder *)&pCVar21->_vptr_CommentHolder)->_vptr_CommentHolder;
          uVar2 = puVar16[3];
          local_3b8._16_4_ = SUB84(pp_Var3,0);
          local_3b8._20_2_ = (undefined2)((ulong)pp_Var3 >> 0x20);
          local_3b8[0x16] = (undefined1)((ulong)pp_Var3 >> 0x30);
          local_3b8[0x17] = (undefined1)((ulong)pp_Var3 >> 0x38);
          uStack_3a0 = (undefined3)uVar2;
          uStack_39d = (undefined1)((ulong)uVar2 >> 0x18);
          uStack_39c = (undefined4)((ulong)uVar2 >> 0x20);
        }
        else {
          pp_Var3 = ((CommentHolder *)&pCVar21->_vptr_CommentHolder)->_vptr_CommentHolder;
          local_3b8._16_4_ = SUB84(pp_Var3,0);
          local_3b8._20_2_ = (undefined2)((ulong)pp_Var3 >> 0x20);
          local_3b8[0x16] = (undefined1)((ulong)pp_Var3 >> 0x30);
          local_3b8[0x17] = (undefined1)((ulong)pp_Var3 >> 0x38);
          local_3b8._0_8_ = (CommentHolder *)*puVar16;
        }
        local_3b8._8_8_ = puVar16[1];
        *puVar16 = pCVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_270._16_4_ = 0x65727453;
        local_270[0x14] = 'a';
        local_270._21_2_ = 0x546d;
        local_270[0x17] = 'y';
        local_270._24_2_ = 0x6570;
        local_270._8_8_ = 10;
        local_270[0x1a] = '\0';
        local_270._0_8_ = local_270 + 0x10;
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d0,(key_type *)local_270);
        std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
        if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
          operator_delete((void *)local_270._0_8_,
                          CONCAT17(local_270[0x17],
                                   CONCAT25(local_270._21_2_,
                                            CONCAT14(local_270[0x14],local_270._16_4_))) + 1);
        }
        if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
          operator_delete((void *)local_3b8._0_8_,
                          CONCAT17(local_3b8[0x17],
                                   CONCAT16(local_3b8[0x16],
                                            CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
        }
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_,
                          CONCAT17(local_388[0x17],
                                   CONCAT16(local_388[0x16],
                                            CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
        }
        if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,
                          CONCAT17(local_2f0[0x17],
                                   CONCAT16(local_2f0[0x16],
                                            CONCAT15(local_2f0[0x15],
                                                     CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) +
                          1);
        }
        if (local_320 != (undefined1  [8])local_310) {
          operator_delete((void *)local_320,
                          CONCAT17(local_310[0]._M_local_buf[7],
                                   CONCAT16(local_310[0]._M_local_buf[6],
                                            CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_310[0]._M_allocated_capacity)
                                           )) + 1);
        }
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d0,
                   "func $Handler$(srv interface{}, stream $grpc$.ServerStream) error {\n");
        (*printer->_vptr_Printer[5])(printer);
        iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                           (pCVar22);
        pcVar33 = "return srv.($Service$Server).$Method$(&$StreamType${stream})\n";
        if ((char)iVar12 == '\0') {
          iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                             (pCVar22);
          pcVar33 = "return srv.($Service$Server).$Method$(&$StreamType${stream})\n";
          if ((char)iVar12 != '\0') {
            (*printer->_vptr_Printer[2])(printer,&local_1d0,"m := new($Request$)\n");
            local_3b8._16_4_ = 0x6f727245;
            local_3b8._20_2_ = 0x5f72;
            local_3b8[0x16] = 'C';
            stack0xfffffffffffffc5f = 0x6b636568;
            local_3b8._8_8_ = 0xb;
            uStack_39d = '\0';
            local_3b8._0_8_ = (CommentHolder *)(local_3b8 + 0x10);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_1d0,(key_type *)local_3b8);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x38707c);
            if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
              operator_delete((void *)local_3b8._0_8_,
                              CONCAT17(local_3b8[0x17],
                                       CONCAT16(local_3b8[0x16],
                                                CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_3b8,&local_1d0);
            GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_3b8,false);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3b8);
            pcVar33 = "return srv.($Service$Server).$Method$(m, &$StreamType${stream})\n";
          }
        }
        (*printer->_vptr_Printer[2])(printer,&local_1d0,pcVar33);
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])
                           (pCVar22);
        cVar11 = '\x01';
        if ((char)iVar12 == '\0') {
          iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                             (pCVar22);
          if ((char)iVar12 == '\0') {
            iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                               (pCVar22);
            cVar11 = (char)iVar12;
          }
          else {
            cVar11 = '\0';
          }
        }
        iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])
                           (pCVar22);
        bVar32 = 1;
        if ((char)iVar12 == '\0') {
          iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                             (pCVar22);
          if ((char)iVar12 == '\0') {
            bVar32 = 0;
          }
          else {
            iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                               (pCVar22);
            bVar32 = (byte)iVar12 ^ 1;
          }
        }
        iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x10])
                           (pCVar22);
        if ((char)iVar12 == '\0') {
          bVar28 = 0;
        }
        else {
          iVar12 = (*((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder[0x11])
                             (pCVar22);
          bVar28 = (byte)iVar12 ^ 1;
        }
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d0,"type $Service$_$Method$Server interface {\n");
        (*printer->_vptr_Printer[5])(printer);
        if (cVar11 != '\0') {
          (*printer->_vptr_Printer[2])(printer,&local_1d0,"Send(*$Response$) error\n");
        }
        if (bVar32 != 0) {
          (*printer->_vptr_Printer[2])(printer,&local_1d0,"Recv() (*$Request$, error)\n");
        }
        if (bVar28 != 0) {
          (*printer->_vptr_Printer[2])(printer,&local_1d0,"SendAndClose(*$Response$) error\n");
        }
        (*printer->_vptr_Printer[2])(printer,&local_1d0,"$grpc$.ServerStream\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        (*printer->_vptr_Printer[2])(printer,&local_1d0,"type $StreamType$ struct {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,&local_1d0,"$grpc$.ServerStream\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
        if (cVar11 != '\0') {
          (*printer->_vptr_Printer[2])
                    (printer,&local_1d0,"func (x *$StreamType$) Send(m *$Response$) error {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[3])(printer,"return x.ServerStream.SendMsg(m)\n");
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n\n");
        }
        if (bVar32 != 0) {
          (*printer->_vptr_Printer[2])
                    (printer,&local_1d0,"func (x *$StreamType$) Recv() (*$Request$, error) {\n");
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[2])(printer,&local_1d0,"m := new($Request$)\n");
          local_388._16_4_ = 0x6f727245;
          local_388._20_2_ = 0x5f72;
          local_388[0x16] = 'C';
          stack0xfffffffffffffc8f = 0x6b636568;
          local_388._8_8_ = 0xb;
          uStack_36d = '\0';
          local_388._0_8_ = local_388 + 0x10;
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_1d0,(key_type *)local_388);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x387241);
          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
            operator_delete((void *)local_388._0_8_,
                            CONCAT17(local_388[0x17],
                                     CONCAT16(local_388[0x16],
                                              CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_388,&local_1d0);
          GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_388,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_388);
          (*printer->_vptr_Printer[3])(printer,"return m, nil\n");
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n\n");
        }
        if (bVar28 != 0) {
          (*printer->_vptr_Printer[2])
                    (printer,&local_1d0,
                     "func (x *$StreamType$) SendAndClose(m *$Response$) error {\n");
          (*printer->_vptr_Printer[5])(printer);
          pcVar25 = "return x.ServerStream.SendMsg(m)\n";
          pcVar33 = ")\n}\n\n";
          goto LAB_003418cb;
        }
      }
      else {
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d0,
                   "func $Handler$(srv interface{}, ctx $context$.Context,\n\tdec func(interface{}) error, interceptor $grpc$.UnaryServerInterceptor) (interface{}, error) {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,&local_1d0,"in := new($Request$)\n");
        local_3b8._16_4_ = 0x6f727245;
        local_3b8._20_2_ = 0x5f72;
        local_3b8[0x16] = 'C';
        stack0xfffffffffffffc5f = 0x6b636568;
        local_3b8._8_8_ = 0xb;
        uStack_39d = '\0';
        local_3b8._0_8_ = (CommentHolder *)(local_3b8 + 0x10);
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1d0,(key_type *)local_3b8);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x386ea8);
        if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
          operator_delete((void *)local_3b8._0_8_,
                          CONCAT17(local_3b8[0x17],
                                   CONCAT16(local_3b8[0x16],
                                            CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_3b8,&local_1d0);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_3b8,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_3b8);
        (*printer->_vptr_Printer[3])(printer,"if interceptor == nil {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d0,"return srv.($Service$Server).$Method$(ctx, in)\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
        (*printer->_vptr_Printer[2])(printer,&local_1d0,"info := &$grpc$.UnaryServerInfo{\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[3])(printer,"Server:     srv,\n");
        (*printer->_vptr_Printer[2])(printer,&local_1d0,"FullMethod: \"$FullMethodName$\",\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d0,
                   "handler := func(ctx $context$.Context, req interface{}) (interface{}, error) {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,&local_1d0,
                   "return srv.($Service$Server).$Method$(ctx, req.(*$Request$))\n");
        (*printer->_vptr_Printer[6])(printer);
        pcVar33 = "\t\t}\n";
        (*printer->_vptr_Printer[3])(printer,"}\n");
        pcVar25 = "return interceptor(ctx, in, info, handler)\n";
LAB_003418cb:
        (*printer->_vptr_Printer[3])(printer,pcVar25);
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,pcVar33 + 2);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      if (local_218 != (CommentHolder *)0x0) {
        (*((CommentHolder *)&local_218->_vptr_CommentHolder)->_vptr_CommentHolder[1])();
      }
      pSVar34 = local_240;
      iVar12 = local_20c + 1;
      iVar13 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
    } while (iVar12 < iVar13);
  }
  (*printer->_vptr_Printer[2])(printer,p_Var27,"var $ServiceDesc$ = $grpc$.ServiceDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var27,"ServiceName: \"$ServicePrefix$$Service$\",\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"HandlerType: (*$Service$Server)(nil),\n");
  (*printer->_vptr_Printer[2])(printer,p_Var27,"Methods: []$grpc$.MethodDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  iVar12 = (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[8])(pSVar34);
  if (0 < iVar12) {
    uVar24 = 0;
    do {
      (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[9])(&local_238,pSVar34,uVar24);
      (**(code **)(*(size_type *)local_238._M_dataplus._M_p + 0x28))(&local_160);
      pcVar33 = local_160;
      uVar5 = stack0xfffffffffffffc5f;
      if (local_158 == 0) {
        local_3b8._0_8_ = local_3b8 + 0x10;
        local_3b8[0x16] = (undefined1)((uint7)uStack_14f >> 0x28);
        local_3b8[0x17] = (undefined1)((uint7)uStack_14f >> 0x30);
        local_3b8._20_2_ = (undefined2)((uint7)uStack_14f >> 0x18);
        if (local_160 == &local_150) {
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_14f,local_150);
          uStack_3a0 = (undefined3)uStack_148;
          uStack_39d = (undefined1)((ulong)uStack_148 >> 0x18);
          uStack_39c = (undefined4)((ulong)uStack_148 >> 0x20);
        }
        else {
          local_3b8._0_8_ = local_160;
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_14f,local_150);
          uStack_3a0 = SUB43(uVar5,1);
        }
        local_3b8._8_8_ = 0;
      }
      else {
        iVar12 = toupper((int)*local_160);
        uVar5 = stack0xfffffffffffffc5f;
        *pcVar33 = (char)iVar12;
        local_3b8._0_8_ = local_3b8 + 0x10;
        local_3b8[0x16] = (undefined1)((uint7)uStack_14f >> 0x28);
        local_3b8[0x17] = (undefined1)((uint7)uStack_14f >> 0x30);
        local_3b8._20_2_ = (undefined2)((uint7)uStack_14f >> 0x18);
        if (local_160 == &local_150) {
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_14f,local_150);
          uStack_3a0 = (undefined3)uStack_148;
          uStack_39d = (undefined1)((ulong)uStack_148 >> 0x18);
          uStack_39c = (undefined4)((ulong)uStack_148 >> 0x20);
        }
        else {
          local_3b8._0_8_ = local_160;
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_14f,local_150);
          uStack_3a0 = SUB43(uVar5,1);
        }
        local_3b8._8_8_ = local_158;
      }
      local_158 = 0;
      local_150 = '\0';
      local_388._0_8_ = local_388 + 0x10;
      local_160 = &local_150;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Method","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,(key_type *)local_388);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
      }
      local_2f0._0_8_ = local_2f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"Service","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,(key_type *)local_2f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                     "_",pmVar14);
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)local_320);
      local_350._0_8_ = local_350 + 0x10;
      pCVar22 = (CommentHolder *)(puVar16 + 2);
      if ((CommentHolder *)*puVar16 == pCVar22) {
        local_350._16_4_ =
             *(undefined4 *)&((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder;
        uVar5 = *(undefined4 *)((long)puVar16 + 0x14);
        uVar6 = *(undefined4 *)(puVar16 + 3);
        uVar7 = *(undefined4 *)((long)puVar16 + 0x1c);
        local_350._20_2_ = (undefined2)uVar5;
        local_350[0x16] = (undefined1)((uint)uVar5 >> 0x10);
        local_350[0x17] = (undefined1)((uint)uVar5 >> 0x18);
        local_350[0x18] = (undefined1)uVar6;
        local_350._25_2_ = (undefined2)((uint)uVar6 >> 8);
        local_350[0x1b] = (undefined1)((uint)uVar6 >> 0x18);
        local_350._28_2_ = (undefined2)uVar7;
        local_350[0x1e] = (undefined1)((uint)uVar7 >> 0x10);
        local_350[0x1f] = (undefined1)((uint)uVar7 >> 0x18);
      }
      else {
        pp_Var3 = ((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder;
        local_350._16_4_ = SUB84(pp_Var3,0);
        local_350._20_2_ = (undefined2)((ulong)pp_Var3 >> 0x20);
        local_350[0x16] = (undefined1)((ulong)pp_Var3 >> 0x30);
        local_350[0x17] = (undefined1)((ulong)pp_Var3 >> 0x38);
        local_350._0_8_ = (CommentHolder *)*puVar16;
      }
      local_350._8_8_ = puVar16[1];
      *puVar16 = pCVar22;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      local_270._0_8_ = local_270 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"Method","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,(key_type *)local_270);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  (local_350,(ulong)(pmVar14->_M_dataplus)._M_p);
      local_388._0_8_ = local_388 + 0x10;
      plVar18 = plVar15 + 2;
      if ((long *)*plVar15 == plVar18) {
        lVar1 = *plVar18;
        lVar9 = plVar15[3];
        local_388._16_4_ = (undefined4)lVar1;
        local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_370 = (undefined3)lVar9;
        uStack_36d = (undefined1)((ulong)lVar9 >> 0x18);
        uStack_36c = (undefined2)((ulong)lVar9 >> 0x20);
        uStack_36a = (undefined1)((ulong)lVar9 >> 0x30);
        uStack_369 = (undefined1)((ulong)lVar9 >> 0x38);
      }
      else {
        lVar1 = *plVar18;
        local_388._16_4_ = (undefined4)lVar1;
        local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_388._0_8_ = (long *)*plVar15;
      }
      local_388._8_8_ = plVar15[1];
      *plVar15 = (long)plVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar16 = (undefined8 *)std::__cxx11::string::append(local_388);
      local_3b8._0_8_ = local_3b8 + 0x10;
      pCVar22 = (CommentHolder *)(puVar16 + 2);
      if ((CommentHolder *)*puVar16 == pCVar22) {
        local_3b8._16_4_ =
             *(undefined4 *)&((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder;
        uVar5 = *(undefined4 *)((long)puVar16 + 0x14);
        uStack_39c = *(undefined4 *)((long)puVar16 + 0x1c);
        local_3b8._20_2_ = (undefined2)uVar5;
        local_3b8[0x16] = (undefined1)((uint)uVar5 >> 0x10);
        uStack_3a0 = (undefined3)*(undefined4 *)(puVar16 + 3);
        unique0x100047b0 = CONCAT31(uStack_3a0,(char)((uint)uVar5 >> 0x18));
        uStack_39d = (undefined1)((uint)*(undefined4 *)(puVar16 + 3) >> 0x18);
      }
      else {
        pp_Var3 = ((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder;
        local_3b8._16_4_ = SUB84(pp_Var3,0);
        local_3b8._20_2_ = (undefined2)((ulong)pp_Var3 >> 0x20);
        local_3b8[0x16] = (undefined1)((ulong)pp_Var3 >> 0x30);
        local_3b8[0x17] = (undefined1)((ulong)pp_Var3 >> 0x38);
        local_3b8._0_8_ = (CommentHolder *)*puVar16;
      }
      local_3b8._8_8_ = puVar16[1];
      *puVar16 = pCVar22;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Handler","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,&local_2c0);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT17(local_2c0.field_2._M_local_buf[7],
                                 CONCAT16(local_2c0.field_2._M_local_buf[6],
                                          CONCAT24(local_2c0.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_2c0.field_2._M_local_buf[3],
                                                            CONCAT21(local_2c0.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_2c0.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,
                        CONCAT17(local_270[0x17],
                                 CONCAT25(local_270._21_2_,
                                          CONCAT14(local_270[0x14],local_270._16_4_))) + 1);
      }
      if ((CommentHolder *)local_350._0_8_ != (CommentHolder *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT17(local_350[0x17],
                                 CONCAT16(local_350[0x16],
                                          CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
      }
      if (local_320 != (undefined1  [8])local_310) {
        operator_delete((void *)local_320,
                        CONCAT17(local_310[0]._M_local_buf[7],
                                 CONCAT16(local_310[0]._M_local_buf[6],
                                          CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_310[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,
                        CONCAT17(local_2f0[0x17],
                                 CONCAT16(local_2f0[0x16],
                                          CONCAT15(local_2f0[0x15],
                                                   CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) + 1
                       );
      }
      cVar11 = (**(code **)(*(size_type *)local_238._M_dataplus._M_p + 0x78))();
      if (cVar11 != '\0') {
        (*printer->_vptr_Printer[3])(printer,"{\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,local_358,"MethodName: \"$Method$\",\n");
        (*printer->_vptr_Printer[2])(printer,local_358,"Handler:    $Handler$,\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"},\n");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_238._M_dataplus._M_p + 8))();
      }
      pSVar34 = local_240;
      uVar23 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar23;
      iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
    } while ((int)uVar23 < iVar12);
  }
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"},\n");
  (*printer->_vptr_Printer[2])(printer,local_358,"Streams: []$grpc$.StreamDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  iVar12 = (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[8])(pSVar34);
  if (0 < iVar12) {
    uVar24 = 0;
    do {
      (*(pSVar34->super_CommentHolder)._vptr_CommentHolder[9])(&local_238,pSVar34,uVar24);
      (**(code **)(*(size_type *)local_238._M_dataplus._M_p + 0x28))(&local_180);
      pcVar33 = local_180;
      uVar5 = stack0xfffffffffffffc5f;
      if (local_178 == 0) {
        local_3b8._0_8_ = local_3b8 + 0x10;
        local_3b8[0x16] = (undefined1)((uint7)uStack_16f >> 0x28);
        local_3b8[0x17] = (undefined1)((uint7)uStack_16f >> 0x30);
        local_3b8._20_2_ = (undefined2)((uint7)uStack_16f >> 0x18);
        if (local_180 == &local_170) {
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_16f,local_170);
          uStack_3a0 = (undefined3)uStack_168;
          uStack_39d = (undefined1)((ulong)uStack_168 >> 0x18);
          uStack_39c = (undefined4)((ulong)uStack_168 >> 0x20);
        }
        else {
          local_3b8._0_8_ = local_180;
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_16f,local_170);
          uStack_3a0 = SUB43(uVar5,1);
        }
        local_3b8._8_8_ = 0;
      }
      else {
        iVar12 = toupper((int)*local_180);
        uVar5 = stack0xfffffffffffffc5f;
        *pcVar33 = (char)iVar12;
        local_3b8._0_8_ = local_3b8 + 0x10;
        local_3b8[0x16] = (undefined1)((uint7)uStack_16f >> 0x28);
        local_3b8[0x17] = (undefined1)((uint7)uStack_16f >> 0x30);
        local_3b8._20_2_ = (undefined2)((uint7)uStack_16f >> 0x18);
        if (local_180 == &local_170) {
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_16f,local_170);
          uStack_3a0 = (undefined3)uStack_168;
          uStack_39d = (undefined1)((ulong)uStack_168 >> 0x18);
          uStack_39c = (undefined4)((ulong)uStack_168 >> 0x20);
        }
        else {
          local_3b8._0_8_ = local_180;
          local_3b8._16_4_ = (undefined4)CONCAT71(uStack_16f,local_170);
          uStack_3a0 = SUB43(uVar5,1);
        }
        local_3b8._8_8_ = local_178;
      }
      local_178 = 0;
      local_170 = '\0';
      local_388._0_8_ = local_388 + 0x10;
      local_180 = &local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Method","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,(key_type *)local_388);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
      }
      local_2f0._0_8_ = local_2f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"Service","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,(key_type *)local_2f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                     "_",pmVar14);
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)local_320);
      local_350._0_8_ = local_350 + 0x10;
      pCVar22 = (CommentHolder *)(puVar16 + 2);
      if ((CommentHolder *)*puVar16 == pCVar22) {
        local_350._16_4_ =
             *(undefined4 *)&((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder;
        uVar5 = *(undefined4 *)((long)puVar16 + 0x14);
        uVar6 = *(undefined4 *)(puVar16 + 3);
        uVar7 = *(undefined4 *)((long)puVar16 + 0x1c);
        local_350._20_2_ = (undefined2)uVar5;
        local_350[0x16] = (undefined1)((uint)uVar5 >> 0x10);
        local_350[0x17] = (undefined1)((uint)uVar5 >> 0x18);
        local_350[0x18] = (undefined1)uVar6;
        local_350._25_2_ = (undefined2)((uint)uVar6 >> 8);
        local_350[0x1b] = (undefined1)((uint)uVar6 >> 0x18);
        local_350._28_2_ = (undefined2)uVar7;
        local_350[0x1e] = (undefined1)((uint)uVar7 >> 0x10);
        local_350[0x1f] = (undefined1)((uint)uVar7 >> 0x18);
      }
      else {
        pp_Var3 = ((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder;
        local_350._16_4_ = SUB84(pp_Var3,0);
        local_350._20_2_ = (undefined2)((ulong)pp_Var3 >> 0x20);
        local_350[0x16] = (undefined1)((ulong)pp_Var3 >> 0x30);
        local_350[0x17] = (undefined1)((ulong)pp_Var3 >> 0x38);
        local_350._0_8_ = (CommentHolder *)*puVar16;
      }
      local_350._8_8_ = puVar16[1];
      *puVar16 = pCVar22;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      local_270._0_8_ = local_270 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"Method","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,(key_type *)local_270);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  (local_350,(ulong)(pmVar14->_M_dataplus)._M_p);
      local_388._0_8_ = local_388 + 0x10;
      plVar18 = plVar15 + 2;
      if ((long *)*plVar15 == plVar18) {
        lVar1 = *plVar18;
        lVar9 = plVar15[3];
        local_388._16_4_ = (undefined4)lVar1;
        local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        uStack_370 = (undefined3)lVar9;
        uStack_36d = (undefined1)((ulong)lVar9 >> 0x18);
        uStack_36c = (undefined2)((ulong)lVar9 >> 0x20);
        uStack_36a = (undefined1)((ulong)lVar9 >> 0x30);
        uStack_369 = (undefined1)((ulong)lVar9 >> 0x38);
      }
      else {
        lVar1 = *plVar18;
        local_388._16_4_ = (undefined4)lVar1;
        local_388._20_2_ = (undefined2)((ulong)lVar1 >> 0x20);
        local_388[0x16] = (undefined1)((ulong)lVar1 >> 0x30);
        local_388[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_388._0_8_ = (long *)*plVar15;
      }
      local_388._8_8_ = plVar15[1];
      *plVar15 = (long)plVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar16 = (undefined8 *)std::__cxx11::string::append(local_388);
      local_3b8._0_8_ = local_3b8 + 0x10;
      pCVar22 = (CommentHolder *)(puVar16 + 2);
      if ((CommentHolder *)*puVar16 == pCVar22) {
        local_3b8._16_4_ =
             *(undefined4 *)&((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder;
        uVar5 = *(undefined4 *)((long)puVar16 + 0x14);
        uStack_39c = *(undefined4 *)((long)puVar16 + 0x1c);
        local_3b8._20_2_ = (undefined2)uVar5;
        local_3b8[0x16] = (undefined1)((uint)uVar5 >> 0x10);
        uStack_3a0 = (undefined3)*(undefined4 *)(puVar16 + 3);
        unique0x100047b4 = CONCAT31(uStack_3a0,(char)((uint)uVar5 >> 0x18));
        uStack_39d = (undefined1)((uint)*(undefined4 *)(puVar16 + 3) >> 0x18);
      }
      else {
        pp_Var3 = ((CommentHolder *)&pCVar22->_vptr_CommentHolder)->_vptr_CommentHolder;
        local_3b8._16_4_ = SUB84(pp_Var3,0);
        local_3b8._20_2_ = (undefined2)((ulong)pp_Var3 >> 0x20);
        local_3b8[0x16] = (undefined1)((ulong)pp_Var3 >> 0x30);
        local_3b8[0x17] = (undefined1)((ulong)pp_Var3 >> 0x38);
        local_3b8._0_8_ = (CommentHolder *)*puVar16;
      }
      local_3b8._8_8_ = puVar16[1];
      *puVar16 = pCVar22;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Handler","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_358,&local_2c0);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT17(local_2c0.field_2._M_local_buf[7],
                                 CONCAT16(local_2c0.field_2._M_local_buf[6],
                                          CONCAT24(local_2c0.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_2c0.field_2._M_local_buf[3],
                                                            CONCAT21(local_2c0.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_2c0.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
      if ((CommentHolder *)local_3b8._0_8_ != (CommentHolder *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,
                        CONCAT17(local_3b8[0x17],
                                 CONCAT16(local_3b8[0x16],
                                          CONCAT24(local_3b8._20_2_,local_3b8._16_4_))) + 1);
      }
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT17(local_388[0x17],
                                 CONCAT16(local_388[0x16],
                                          CONCAT24(local_388._20_2_,local_388._16_4_))) + 1);
      }
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,
                        CONCAT17(local_270[0x17],
                                 CONCAT25(local_270._21_2_,
                                          CONCAT14(local_270[0x14],local_270._16_4_))) + 1);
      }
      if ((CommentHolder *)local_350._0_8_ != (CommentHolder *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT17(local_350[0x17],
                                 CONCAT16(local_350[0x16],
                                          CONCAT24(local_350._20_2_,local_350._16_4_))) + 1);
      }
      if (local_320 != (undefined1  [8])local_310) {
        operator_delete((void *)local_320,
                        CONCAT17(local_310[0]._M_local_buf[7],
                                 CONCAT16(local_310[0]._M_local_buf[6],
                                          CONCAT24(local_310[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_310[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,
                        CONCAT17(local_2f0[0x17],
                                 CONCAT16(local_2f0[0x16],
                                          CONCAT15(local_2f0[0x15],
                                                   CONCAT14(local_2f0[0x14],local_2f0._16_4_)))) + 1
                       );
      }
      cVar11 = (**(code **)(*(size_type *)local_238._M_dataplus._M_p + 0x78))();
      if (cVar11 == '\0') {
        (*printer->_vptr_Printer[3])(printer,"{\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,local_358,"StreamName:    \"$Method$\",\n");
        (*printer->_vptr_Printer[2])(printer,local_358,"Handler:       $Handler$,\n");
        _Var10._M_p = local_238._M_dataplus._M_p;
        cVar11 = (**(code **)(*(size_type *)local_238._M_dataplus._M_p + 0x80))
                           (local_238._M_dataplus._M_p);
        if (cVar11 == '\0') {
LAB_003423a9:
          _Var10._M_p = local_238._M_dataplus._M_p;
          cVar11 = (**(code **)(*(size_type *)local_238._M_dataplus._M_p + 0x80))
                             (local_238._M_dataplus._M_p);
          if (cVar11 == '\0') {
            cVar11 = (**(code **)(*(size_type *)_Var10._M_p + 0x88))(_Var10._M_p);
            pcVar33 = "ServerStreams: true,\n";
            if (cVar11 != '\0') goto LAB_003423ef;
          }
          (*printer->_vptr_Printer[3])(printer,"ServerStreams: true,\n");
          pcVar33 = "ClientStreams: true,\n";
        }
        else {
          cVar11 = (**(code **)(*(size_type *)_Var10._M_p + 0x88))(_Var10._M_p);
          pcVar33 = "ClientStreams: true,\n";
          if (cVar11 != '\0') goto LAB_003423a9;
        }
LAB_003423ef:
        (*printer->_vptr_Printer[3])(printer,pcVar33);
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"},\n");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_238._M_dataplus._M_p + 8))();
      }
      pSVar34 = local_240;
      uVar23 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar23;
      iVar12 = (*(local_240->super_CommentHolder)._vptr_CommentHolder[8])(local_240);
    } while ((int)uVar23 < iVar12);
  }
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"},\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n");
  return;
}

Assistant:

void GenerateService(const grpc_generator::Service *service,
                     grpc_generator::Printer *printer,
                     std::map<grpc::string, grpc::string> vars) {
  vars["Service"] = exportName(service->name());
  // Client Interface
  printer->Print(vars, "// Client API for $Service$ service\n");
  printer->Print(vars, "type $Service$Client interface {\n");
  printer->Indent();
  vars["Ending"] = "\n";
  for (int i = 0; i < service->method_count(); i++) {
    GenerateClientMethodSignature(service->method(i).get(), printer, vars);
  }
  printer->Outdent();
  printer->Print("}\n\n");

  // Client structure
  vars["ServiceUnexported"] = unexportName(vars["Service"]);
  printer->Print(vars, "type $ServiceUnexported$Client struct {\n");
  printer->Indent();
  printer->Print(vars, "cc $grpc$.ClientConnInterface\n");
  printer->Outdent();
  printer->Print("}\n\n");

  // NewClient
  printer->Print(vars,
                 "func New$Service$Client(cc $grpc$.ClientConnInterface) "
                 "$Service$Client {\n");
  printer->Indent();
  printer->Print(vars, "return &$ServiceUnexported$Client{cc}");
  printer->Outdent();
  printer->Print("\n}\n\n");

  int unary_methods = 0, streaming_methods = 0;
  vars["ServiceDesc"] = "_" + vars["Service"] + "_serviceDesc";
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    if (method->NoStreaming()) {
      vars["MethodDesc"] =
          vars["ServiceDesc"] + ".Method[" + as_string(unary_methods) + "]";
      unary_methods++;
    } else {
      vars["MethodDesc"] = vars["ServiceDesc"] + ".Streams[" +
                           as_string(streaming_methods) + "]";
      streaming_methods++;
    }
    GenerateClientMethod(method.get(), printer, vars);
  }

  // Server Interface
  printer->Print(vars, "// Server API for $Service$ service\n");
  printer->Print(vars, "type $Service$Server interface {\n");
  printer->Indent();
  vars["Ending"] = "\n";
  for (int i = 0; i < service->method_count(); i++) {
    GenerateServerMethodSignature(service->method(i).get(), printer, vars);
  }
  printer->Print(vars, "mustEmbedUnimplemented$Service$Server()\n");
  printer->Outdent();
  printer->Print("}\n\n");

  printer->Print(vars, "type Unimplemented$Service$Server struct {\n");
  printer->Print("}\n\n");

  vars["Ending"] = " {\n";
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Nil"] = method->NoStreaming() ? "nil, " : "";
    printer->Print(vars, "func (Unimplemented$Service$Server) ");
    GenerateServerMethodSignature(method.get(), printer, vars);
    printer->Indent();
    printer->Print(vars,
                   "return $Nil$status.Errorf(codes.Unimplemented, \"method "
                   "$Method$ not implemented\")\n");
    printer->Outdent();
    printer->Print("}\n");
    printer->Print("\n");
  }

  printer->Print(vars,
                 "func (Unimplemented$Service$Server) "
                 "mustEmbedUnimplemented$Service$Server() {}");
  printer->Print("\n\n");

  printer->Print(vars, "type Unsafe$Service$Server interface {\n");
  printer->Indent();
  printer->Print(vars, "mustEmbedUnimplemented$Service$Server()\n");
  printer->Outdent();
  printer->Print("}\n\n");
  // Server registration.
  printer->Print(vars,
                 "func Register$Service$Server(s $grpc$.ServiceRegistrar, srv "
                 "$Service$Server) {\n");
  printer->Indent();
  printer->Print(vars, "s.RegisterService(&$ServiceDesc$, srv)\n");
  printer->Outdent();
  printer->Print("}\n\n");

  for (int i = 0; i < service->method_count(); i++) {
    GenerateServerMethod(service->method(i).get(), printer, vars);
  }

  // Service Descriptor
  printer->Print(vars, "var $ServiceDesc$ = $grpc$.ServiceDesc{\n");
  printer->Indent();
  printer->Print(vars, "ServiceName: \"$ServicePrefix$$Service$\",\n");
  printer->Print(vars, "HandlerType: (*$Service$Server)(nil),\n");
  printer->Print(vars, "Methods: []$grpc$.MethodDesc{\n");
  printer->Indent();
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Handler"] = "_" + vars["Service"] + "_" + vars["Method"] + "_Handler";
    if (method->NoStreaming()) {
      printer->Print("{\n");
      printer->Indent();
      printer->Print(vars, "MethodName: \"$Method$\",\n");
      printer->Print(vars, "Handler:    $Handler$,\n");
      printer->Outdent();
      printer->Print("},\n");
    }
  }
  printer->Outdent();
  printer->Print("},\n");
  printer->Print(vars, "Streams: []$grpc$.StreamDesc{\n");
  printer->Indent();
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Handler"] = "_" + vars["Service"] + "_" + vars["Method"] + "_Handler";
    if (!method->NoStreaming()) {
      printer->Print("{\n");
      printer->Indent();
      printer->Print(vars, "StreamName:    \"$Method$\",\n");
      printer->Print(vars, "Handler:       $Handler$,\n");
      if (ClientOnlyStreaming(method.get())) {
        printer->Print("ClientStreams: true,\n");
      } else if (ServerOnlyStreaming(method.get())) {
        printer->Print("ServerStreams: true,\n");
      } else {
        printer->Print("ServerStreams: true,\n");
        printer->Print("ClientStreams: true,\n");
      }
      printer->Outdent();
      printer->Print("},\n");
    }
  }
  printer->Outdent();
  printer->Print("},\n");
  printer->Outdent();
  printer->Print("}\n");
}